

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

void embree::avx::ConeCurveMiMBIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  float fVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  uint uVar80;
  uint uVar81;
  long lVar82;
  uint uVar83;
  undefined1 auVar84 [8];
  ulong uVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar99;
  float fVar102;
  undefined1 auVar89 [16];
  float fVar108;
  float fVar111;
  float fVar113;
  undefined1 auVar92 [32];
  float fVar100;
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar109;
  float fVar112;
  float fVar114;
  float fVar115;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar101;
  float fVar104;
  float fVar107;
  float fVar110;
  undefined1 auVar95 [32];
  undefined1 auVar90 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar116;
  float fVar125;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar126;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar127;
  float fVar141;
  undefined1 auVar128 [16];
  float fVar139;
  float fVar140;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar142;
  float fVar145;
  float fVar146;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar147;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar171;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  float fVar172;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [28];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  float fVar201;
  float fVar202;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar219;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar230;
  undefined1 auVar223 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  float fVar233;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar244;
  undefined1 auVar237 [64];
  float fVar245;
  undefined1 auVar246 [32];
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar247 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 (*local_6a0) [16];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  RayHitK<8> *local_5d0;
  size_t local_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar91 [32];
  undefined1 auVar218 [64];
  
  pSVar10 = context->scene;
  uVar83 = line->sharedGeomID;
  pGVar11 = (pSVar10->geometries).items[uVar83].ptr;
  fVar202 = (pGVar11->time_range).lower;
  fVar202 = pGVar11->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar202) / ((pGVar11->time_range).upper - fVar202));
  auVar90 = vroundss_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),9);
  auVar90 = vminss_avx(auVar90,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar90 = vmaxss_avx(ZEXT816(0),auVar90);
  uVar81 = (line->v0).field_0.i[0];
  lVar12 = *(long *)&pGVar11[3].time_range.upper;
  lVar82 = (long)(int)auVar90._0_4_ * 0x38;
  lVar13 = *(long *)(lVar12 + lVar82);
  lVar14 = *(long *)(lVar12 + 0x10 + lVar82);
  uVar80 = (line->v0).field_0.i[1];
  uVar4 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[4];
  puVar1 = (undefined8 *)(lVar13 + lVar14 * (ulong)uVar5);
  uStack_6f0 = *puVar1;
  _local_700 = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar81);
  uStack_6e8 = puVar1[1];
  uVar6 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar13 + lVar14 * (ulong)uVar6);
  uStack_5f0 = *puVar1;
  _local_600 = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar80);
  uStack_5e8 = puVar1[1];
  uVar7 = (line->v0).field_0.i[6];
  auVar148._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar7);
  auVar148._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar4);
  uVar8 = (line->v0).field_0.i[3];
  uVar9 = (line->v0).field_0.i[7];
  auVar160._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar9);
  auVar160._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)uVar8);
  auVar165._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar5 + 1));
  auVar165._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar81 + 1));
  auVar173._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar6 + 1));
  auVar173._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar80 + 1));
  auVar187._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar7 + 1));
  auVar187._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar4 + 1));
  auVar196._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar9 + 1));
  auVar196._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar14 * (ulong)(uVar8 + 1));
  lVar13 = *(long *)(lVar12 + 0x38 + lVar82);
  lVar12 = *(long *)(lVar12 + 0x48 + lVar82);
  auVar203._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar5 * lVar12);
  auVar203._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar81 * lVar12);
  auVar214._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar6 * lVar12);
  auVar214._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar80 * lVar12);
  auVar220._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar7 * lVar12);
  auVar220._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar4 * lVar12);
  auVar234._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar9 * lVar12);
  auVar234._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar8 * lVar12);
  auVar129._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar5 + 1) * lVar12);
  auVar129._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar81 + 1) * lVar12);
  auVar117._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar7 + 1) * lVar12);
  auVar117._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar4 + 1) * lVar12);
  fVar202 = fVar202 - auVar90._0_4_;
  auVar178 = vunpcklps_avx(_local_700,auVar148);
  auVar152 = vunpckhps_avx(_local_700,auVar148);
  auVar192 = vunpcklps_avx(_local_600,auVar160);
  auVar163 = vunpckhps_avx(_local_600,auVar160);
  auVar44 = vunpcklps_avx(auVar178,auVar192);
  auVar178 = vunpckhps_avx(auVar178,auVar192);
  auVar45 = vunpcklps_avx(auVar152,auVar163);
  auVar152 = vunpckhps_avx(auVar152,auVar163);
  auVar205 = vunpcklps_avx(auVar165,auVar187);
  auVar163 = vunpckhps_avx(auVar165,auVar187);
  auVar236 = vunpcklps_avx(auVar173,auVar196);
  auVar192 = vunpckhps_avx(auVar173,auVar196);
  auVar46 = vunpcklps_avx(auVar205,auVar236);
  auVar205 = vunpckhps_avx(auVar205,auVar236);
  auVar47 = vunpcklps_avx(auVar163,auVar192);
  auVar163 = vunpckhps_avx(auVar163,auVar192);
  auVar246 = vunpcklps_avx(auVar203,auVar220);
  auVar192 = vunpckhps_avx(auVar203,auVar220);
  auVar48 = vunpcklps_avx(auVar214,auVar234);
  auVar236 = vunpckhps_avx(auVar214,auVar234);
  auVar91 = vunpcklps_avx(auVar246,auVar48);
  auVar246 = vunpckhps_avx(auVar246,auVar48);
  auVar92 = vunpcklps_avx(auVar192,auVar236);
  auVar192 = vunpckhps_avx(auVar192,auVar236);
  auVar49 = vunpcklps_avx(auVar129,auVar117);
  auVar236 = vunpckhps_avx(auVar129,auVar117);
  auVar130._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar6 + 1) * lVar12);
  auVar130._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar80 + 1) * lVar12);
  auVar221._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar12 * (ulong)(uVar9 + 1));
  auVar221._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar8 + 1) * lVar12);
  auVar117 = vunpcklps_avx(auVar130,auVar221);
  auVar48 = vunpckhps_avx(auVar130,auVar221);
  auVar118 = vunpcklps_avx(auVar49,auVar117);
  auVar49 = vunpckhps_avx(auVar49,auVar117);
  auVar117 = vunpcklps_avx(auVar236,auVar48);
  auVar236 = vunpckhps_avx(auVar236,auVar48);
  auVar90 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
  auVar43 = vshufps_avx(ZEXT416((uint)(1.0 - fVar202)),ZEXT416((uint)(1.0 - fVar202)),0);
  fVar202 = auVar90._0_4_;
  fVar208 = auVar90._4_4_;
  fVar245 = auVar90._8_4_;
  fVar142 = auVar90._12_4_;
  fVar115 = auVar91._28_4_;
  fVar127 = auVar43._0_4_;
  fVar139 = auVar43._4_4_;
  fVar140 = auVar43._8_4_;
  fVar141 = auVar43._12_4_;
  auVar149._0_4_ = auVar91._0_4_ * fVar202 + fVar127 * auVar44._0_4_;
  auVar149._4_4_ = auVar91._4_4_ * fVar208 + fVar139 * auVar44._4_4_;
  auVar149._8_4_ = auVar91._8_4_ * fVar245 + fVar140 * auVar44._8_4_;
  auVar149._12_4_ = auVar91._12_4_ * fVar142 + fVar141 * auVar44._12_4_;
  auVar149._16_4_ = auVar91._16_4_ * fVar202 + fVar127 * auVar44._16_4_;
  auVar149._20_4_ = auVar91._20_4_ * fVar208 + fVar139 * auVar44._20_4_;
  auVar149._24_4_ = auVar91._24_4_ * fVar245 + fVar140 * auVar44._24_4_;
  auVar149._28_4_ = fVar115 + auVar44._28_4_;
  auVar166._0_4_ = auVar178._0_4_ * fVar127 + fVar202 * auVar246._0_4_;
  auVar166._4_4_ = auVar178._4_4_ * fVar139 + fVar208 * auVar246._4_4_;
  auVar166._8_4_ = auVar178._8_4_ * fVar140 + fVar245 * auVar246._8_4_;
  auVar166._12_4_ = auVar178._12_4_ * fVar141 + fVar142 * auVar246._12_4_;
  auVar166._16_4_ = auVar178._16_4_ * fVar127 + fVar202 * auVar246._16_4_;
  auVar166._20_4_ = auVar178._20_4_ * fVar139 + fVar208 * auVar246._20_4_;
  auVar166._24_4_ = auVar178._24_4_ * fVar140 + fVar245 * auVar246._24_4_;
  auVar166._28_4_ = fVar115 + auVar246._28_4_;
  auVar215._0_4_ = auVar45._0_4_ * fVar127 + auVar92._0_4_ * fVar202;
  auVar215._4_4_ = auVar45._4_4_ * fVar139 + auVar92._4_4_ * fVar208;
  auVar215._8_4_ = auVar45._8_4_ * fVar140 + auVar92._8_4_ * fVar245;
  auVar215._12_4_ = auVar45._12_4_ * fVar141 + auVar92._12_4_ * fVar142;
  auVar215._16_4_ = auVar45._16_4_ * fVar127 + auVar92._16_4_ * fVar202;
  auVar215._20_4_ = auVar45._20_4_ * fVar139 + auVar92._20_4_ * fVar208;
  auVar215._24_4_ = auVar45._24_4_ * fVar140 + auVar92._24_4_ * fVar245;
  auVar215._28_4_ = fVar115 + auVar92._28_4_;
  auVar197._0_4_ = auVar192._0_4_ * fVar202 + fVar127 * auVar152._0_4_;
  auVar197._4_4_ = auVar192._4_4_ * fVar208 + fVar139 * auVar152._4_4_;
  auVar197._8_4_ = auVar192._8_4_ * fVar245 + fVar140 * auVar152._8_4_;
  auVar197._12_4_ = auVar192._12_4_ * fVar142 + fVar141 * auVar152._12_4_;
  auVar197._16_4_ = auVar192._16_4_ * fVar202 + fVar127 * auVar152._16_4_;
  auVar197._20_4_ = auVar192._20_4_ * fVar208 + fVar139 * auVar152._20_4_;
  auVar197._24_4_ = auVar192._24_4_ * fVar245 + fVar140 * auVar152._24_4_;
  auVar197._28_4_ = auVar192._28_4_ + auVar152._28_4_;
  auVar204._0_4_ = fVar127 * auVar46._0_4_ + auVar118._0_4_ * fVar202;
  auVar204._4_4_ = fVar139 * auVar46._4_4_ + auVar118._4_4_ * fVar208;
  auVar204._8_4_ = fVar140 * auVar46._8_4_ + auVar118._8_4_ * fVar245;
  auVar204._12_4_ = fVar141 * auVar46._12_4_ + auVar118._12_4_ * fVar142;
  auVar204._16_4_ = fVar127 * auVar46._16_4_ + auVar118._16_4_ * fVar202;
  auVar204._20_4_ = fVar139 * auVar46._20_4_ + auVar118._20_4_ * fVar208;
  auVar204._24_4_ = fVar140 * auVar46._24_4_ + auVar118._24_4_ * fVar245;
  auVar204._28_4_ = fVar142 + auVar152._28_4_;
  local_600._0_4_ = auVar205._0_4_;
  local_600._4_4_ = auVar205._4_4_;
  fStack_5f8 = auVar205._8_4_;
  fStack_5f4 = auVar205._12_4_;
  uStack_5f0._0_4_ = auVar205._16_4_;
  uStack_5f0._4_4_ = auVar205._20_4_;
  uStack_5e8._0_4_ = auVar205._24_4_;
  auVar222._0_4_ = auVar49._0_4_ * fVar202 + fVar127 * (float)local_600._0_4_;
  auVar222._4_4_ = auVar49._4_4_ * fVar208 + fVar139 * (float)local_600._4_4_;
  auVar222._8_4_ = auVar49._8_4_ * fVar245 + fVar140 * fStack_5f8;
  auVar222._12_4_ = auVar49._12_4_ * fVar142 + fVar141 * fStack_5f4;
  auVar222._16_4_ = auVar49._16_4_ * fVar202 + fVar127 * (float)uStack_5f0;
  auVar222._20_4_ = auVar49._20_4_ * fVar208 + fVar139 * uStack_5f0._4_4_;
  auVar222._24_4_ = auVar49._24_4_ * fVar245 + fVar140 * (float)uStack_5e8;
  auVar222._28_4_ = auVar192._28_4_ + fVar142;
  local_700._0_4_ = auVar47._0_4_;
  local_700._4_4_ = auVar47._4_4_;
  fStack_6f8 = auVar47._8_4_;
  fStack_6f4 = auVar47._12_4_;
  uStack_6f0._0_4_ = auVar47._16_4_;
  uStack_6f0._4_4_ = auVar47._20_4_;
  uStack_6e8._0_4_ = auVar47._24_4_;
  auVar235._0_4_ = fVar127 * (float)local_700._0_4_ + fVar202 * auVar117._0_4_;
  auVar235._4_4_ = fVar139 * (float)local_700._4_4_ + fVar208 * auVar117._4_4_;
  auVar235._8_4_ = fVar140 * fStack_6f8 + fVar245 * auVar117._8_4_;
  auVar235._12_4_ = fVar141 * fStack_6f4 + fVar142 * auVar117._12_4_;
  auVar235._16_4_ = fVar127 * (float)uStack_6f0 + fVar202 * auVar117._16_4_;
  auVar235._20_4_ = fVar139 * uStack_6f0._4_4_ + fVar208 * auVar117._20_4_;
  auVar235._24_4_ = fVar140 * (float)uStack_6e8 + fVar245 * auVar117._24_4_;
  auVar235._28_4_ = fVar142 + auVar117._28_4_;
  local_6e0._0_4_ = auVar163._0_4_;
  local_6e0._4_4_ = auVar163._4_4_;
  fStack_6d8 = auVar163._8_4_;
  fStack_6d4 = auVar163._12_4_;
  fStack_6d0 = auVar163._16_4_;
  fStack_6cc = auVar163._20_4_;
  fStack_6c8 = auVar163._24_4_;
  auVar89._0_4_ = fVar127 * (float)local_6e0._0_4_ + fVar202 * auVar236._0_4_;
  auVar89._4_4_ = fVar139 * (float)local_6e0._4_4_ + fVar208 * auVar236._4_4_;
  auVar89._8_4_ = fVar140 * fStack_6d8 + fVar245 * auVar236._8_4_;
  auVar89._12_4_ = fVar141 * fStack_6d4 + fVar142 * auVar236._12_4_;
  auVar91._16_4_ = fVar127 * fStack_6d0 + fVar202 * auVar236._16_4_;
  auVar91._0_16_ = auVar89;
  auVar91._20_4_ = fVar139 * fStack_6cc + fVar208 * auVar236._20_4_;
  auVar91._24_4_ = fVar140 * fStack_6c8 + fVar245 * auVar236._24_4_;
  auVar91._28_4_ = auVar117._28_4_ + auVar236._28_4_;
  auVar90 = vpcmpeqd_avx(auVar89,auVar89);
  auVar43 = vpcmpeqd_avx(auVar90,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar90 = vpcmpeqd_avx(auVar90,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_270 = vshufps_avx(ZEXT416(uVar83),ZEXT416(uVar83),0);
  local_280 = local_270;
  local_6e0._4_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
  local_700._4_4_ = *(undefined4 *)(ray + k * 4 + 0xa0);
  local_500 = *(float *)(ray + k * 4 + 0xc0);
  auVar128 = ZEXT416((uint)((float)local_6e0._4_4_ * (float)local_6e0._4_4_ +
                           (float)local_700._4_4_ * (float)local_700._4_4_ + local_500 * local_500))
  ;
  auVar128 = vshufps_avx(auVar128,auVar128,0);
  auVar131._16_16_ = auVar128;
  auVar131._0_16_ = auVar128;
  auVar152 = vrcpps_avx(auVar131);
  auVar92._16_16_ = auVar90;
  auVar92._0_16_ = auVar43;
  fVar142 = auVar152._0_4_;
  fVar127 = auVar152._4_4_;
  auVar163._4_4_ = fVar127 * auVar128._4_4_;
  auVar163._0_4_ = fVar142 * auVar128._0_4_;
  fVar139 = auVar152._8_4_;
  auVar163._8_4_ = fVar139 * auVar128._8_4_;
  fVar140 = auVar152._12_4_;
  auVar163._12_4_ = fVar140 * auVar128._12_4_;
  fVar141 = auVar152._16_4_;
  auVar163._16_4_ = fVar141 * auVar128._0_4_;
  fVar145 = auVar152._20_4_;
  auVar163._20_4_ = fVar145 * auVar128._4_4_;
  fVar146 = auVar152._24_4_;
  auVar163._24_4_ = fVar146 * auVar128._8_4_;
  auVar163._28_4_ = auVar90._12_4_;
  auVar118._8_4_ = 0x3f800000;
  auVar118._0_8_ = 0x3f8000003f800000;
  auVar118._12_4_ = 0x3f800000;
  auVar118._16_4_ = 0x3f800000;
  auVar118._20_4_ = 0x3f800000;
  auVar118._24_4_ = 0x3f800000;
  auVar118._28_4_ = 0x3f800000;
  auVar163 = vsubps_avx(auVar118,auVar163);
  fVar115 = auVar152._28_4_ + auVar163._28_4_;
  auVar192._4_4_ = (auVar204._4_4_ + auVar149._4_4_) * 0.5;
  auVar192._0_4_ = (auVar204._0_4_ + auVar149._0_4_) * 0.5;
  auVar192._8_4_ = (auVar204._8_4_ + auVar149._8_4_) * 0.5;
  auVar192._12_4_ = (auVar204._12_4_ + auVar149._12_4_) * 0.5;
  auVar192._16_4_ = (auVar204._16_4_ + auVar149._16_4_) * 0.5;
  auVar192._20_4_ = (auVar204._20_4_ + auVar149._20_4_) * 0.5;
  auVar192._24_4_ = (auVar204._24_4_ + auVar149._24_4_) * 0.5;
  auVar192._28_4_ = auVar204._28_4_ + auVar149._28_4_;
  auVar152._4_4_ = (auVar222._4_4_ + auVar166._4_4_) * 0.5;
  auVar152._0_4_ = (auVar222._0_4_ + auVar166._0_4_) * 0.5;
  auVar152._8_4_ = (auVar222._8_4_ + auVar166._8_4_) * 0.5;
  auVar152._12_4_ = (auVar222._12_4_ + auVar166._12_4_) * 0.5;
  auVar152._16_4_ = (auVar222._16_4_ + auVar166._16_4_) * 0.5;
  auVar152._20_4_ = (auVar222._20_4_ + auVar166._20_4_) * 0.5;
  auVar152._24_4_ = (auVar222._24_4_ + auVar166._24_4_) * 0.5;
  auVar152._28_4_ = auVar222._28_4_ + auVar166._28_4_;
  auVar178._4_4_ = (auVar215._4_4_ + auVar235._4_4_) * 0.5;
  auVar178._0_4_ = (auVar215._0_4_ + auVar235._0_4_) * 0.5;
  auVar178._8_4_ = (auVar215._8_4_ + auVar235._8_4_) * 0.5;
  auVar178._12_4_ = (auVar215._12_4_ + auVar235._12_4_) * 0.5;
  auVar178._16_4_ = (auVar215._16_4_ + auVar235._16_4_) * 0.5;
  auVar178._20_4_ = (auVar215._20_4_ + auVar235._20_4_) * 0.5;
  auVar178._24_4_ = (auVar215._24_4_ + auVar235._24_4_) * 0.5;
  auVar178._28_4_ = 0x3f000000;
  fVar202 = *(float *)(ray + k * 4 + 0x20);
  auVar161._4_4_ = fVar202;
  auVar161._0_4_ = fVar202;
  auVar161._8_4_ = fVar202;
  auVar161._12_4_ = fVar202;
  auVar161._16_4_ = fVar202;
  auVar161._20_4_ = fVar202;
  auVar161._24_4_ = fVar202;
  auVar161._28_4_ = fVar202;
  auVar152 = vsubps_avx(auVar152,auVar161);
  fVar208 = *(float *)(ray + k * 4 + 0x40);
  auVar174._4_4_ = fVar208;
  auVar174._0_4_ = fVar208;
  auVar174._8_4_ = fVar208;
  auVar174._12_4_ = fVar208;
  auVar174._16_4_ = fVar208;
  auVar174._20_4_ = fVar208;
  auVar174._24_4_ = fVar208;
  auVar174._28_4_ = fVar208;
  auVar178 = vsubps_avx(auVar178,auVar174);
  fVar245 = *(float *)(ray + k * 4);
  auVar143._4_4_ = fVar245;
  auVar143._0_4_ = fVar245;
  auVar143._8_4_ = fVar245;
  auVar143._12_4_ = fVar245;
  auVar143._16_4_ = fVar245;
  auVar143._20_4_ = fVar245;
  auVar143._24_4_ = fVar245;
  auVar143._28_4_ = fVar245;
  auVar192 = vsubps_avx(auVar192,auVar143);
  fStack_684 = auVar192._28_4_ + auVar152._28_4_ + auVar178._28_4_;
  fVar116 = ((float)local_6e0._4_4_ * auVar192._0_4_ +
            (float)local_700._4_4_ * auVar152._0_4_ + local_500 * auVar178._0_4_) *
            (fVar142 + fVar142 * auVar163._0_4_);
  fVar125 = ((float)local_6e0._4_4_ * auVar192._4_4_ +
            (float)local_700._4_4_ * auVar152._4_4_ + local_500 * auVar178._4_4_) *
            (fVar127 + fVar127 * auVar163._4_4_);
  fStack_698 = ((float)local_6e0._4_4_ * auVar192._8_4_ +
               (float)local_700._4_4_ * auVar152._8_4_ + local_500 * auVar178._8_4_) *
               (fVar139 + fVar139 * auVar163._8_4_);
  fStack_694 = ((float)local_6e0._4_4_ * auVar192._12_4_ +
               (float)local_700._4_4_ * auVar152._12_4_ + local_500 * auVar178._12_4_) *
               (fVar140 + fVar140 * auVar163._12_4_);
  fStack_690 = ((float)local_6e0._4_4_ * auVar192._16_4_ +
               (float)local_700._4_4_ * auVar152._16_4_ + local_500 * auVar178._16_4_) *
               (fVar141 + fVar141 * auVar163._16_4_);
  fStack_68c = ((float)local_6e0._4_4_ * auVar192._20_4_ +
               (float)local_700._4_4_ * auVar152._20_4_ + local_500 * auVar178._20_4_) *
               (fVar145 + fVar145 * auVar163._20_4_);
  fStack_688 = ((float)local_6e0._4_4_ * auVar192._24_4_ +
               (float)local_700._4_4_ * auVar152._24_4_ + local_500 * auVar178._24_4_) *
               (fVar146 + fVar146 * auVar163._24_4_);
  auVar132._0_4_ = fVar245 + (float)local_6e0._4_4_ * fVar116;
  auVar132._4_4_ = fVar245 + (float)local_6e0._4_4_ * fVar125;
  auVar132._8_4_ = fVar245 + (float)local_6e0._4_4_ * fStack_698;
  auVar132._12_4_ = fVar245 + (float)local_6e0._4_4_ * fStack_694;
  auVar132._16_4_ = fVar245 + (float)local_6e0._4_4_ * fStack_690;
  auVar132._20_4_ = fVar245 + (float)local_6e0._4_4_ * fStack_68c;
  auVar132._24_4_ = fVar245 + (float)local_6e0._4_4_ * fStack_688;
  auVar132._28_4_ = fVar245 + fVar115;
  auVar162._0_4_ = fVar202 + (float)local_700._4_4_ * fVar116;
  auVar162._4_4_ = fVar202 + (float)local_700._4_4_ * fVar125;
  auVar162._8_4_ = fVar202 + (float)local_700._4_4_ * fStack_698;
  auVar162._12_4_ = fVar202 + (float)local_700._4_4_ * fStack_694;
  auVar162._16_4_ = fVar202 + (float)local_700._4_4_ * fStack_690;
  auVar162._20_4_ = fVar202 + (float)local_700._4_4_ * fStack_68c;
  auVar162._24_4_ = fVar202 + (float)local_700._4_4_ * fStack_688;
  auVar162._28_4_ = fVar202 + fVar115;
  auVar119._0_4_ = fVar208 + local_500 * fVar116;
  auVar119._4_4_ = fVar208 + local_500 * fVar125;
  auVar119._8_4_ = fVar208 + local_500 * fStack_698;
  auVar119._12_4_ = fVar208 + local_500 * fStack_694;
  auVar119._16_4_ = fVar208 + local_500 * fStack_690;
  auVar119._20_4_ = fVar208 + local_500 * fStack_68c;
  auVar119._24_4_ = fVar208 + local_500 * fStack_688;
  auVar119._28_4_ = fVar208 + fVar115;
  auVar163 = vsubps_avx(auVar222,auVar166);
  local_520 = vsubps_avx(auVar235,auVar215);
  fVar202 = local_520._0_4_;
  fVar140 = local_520._4_4_;
  fVar18 = local_520._8_4_;
  fVar23 = local_520._12_4_;
  fVar28 = local_520._16_4_;
  fVar33 = local_520._20_4_;
  fVar38 = local_520._24_4_;
  fVar208 = auVar163._0_4_;
  fVar141 = auVar163._4_4_;
  fVar19 = auVar163._8_4_;
  fVar24 = auVar163._12_4_;
  fVar29 = auVar163._16_4_;
  fVar34 = auVar163._20_4_;
  fVar39 = auVar163._24_4_;
  local_680 = vsubps_avx(auVar204,auVar149);
  fVar142 = local_680._0_4_;
  fVar145 = local_680._4_4_;
  fVar20 = local_680._8_4_;
  fVar25 = local_680._12_4_;
  fVar30 = local_680._16_4_;
  fVar35 = local_680._20_4_;
  fVar40 = local_680._24_4_;
  fVar233 = fVar208 * fVar208 + fVar202 * fVar202 + fVar142 * fVar142;
  fVar238 = fVar141 * fVar141 + fVar140 * fVar140 + fVar145 * fVar145;
  fVar239 = fVar19 * fVar19 + fVar18 * fVar18 + fVar20 * fVar20;
  fVar240 = fVar24 * fVar24 + fVar23 * fVar23 + fVar25 * fVar25;
  fVar241 = fVar29 * fVar29 + fVar28 * fVar28 + fVar30 * fVar30;
  fVar242 = fVar34 * fVar34 + fVar33 * fVar33 + fVar35 * fVar35;
  fVar243 = fVar39 * fVar39 + fVar38 * fVar38 + fVar40 * fVar40;
  fVar244 = fVar245 + fVar115 + fVar245;
  _local_600 = vsubps_avx(auVar162,auVar166);
  local_540 = vsubps_avx(auVar119,auVar215);
  fVar201 = local_540._0_4_;
  fVar207 = local_540._4_4_;
  fVar209 = local_540._8_4_;
  fVar210 = local_540._12_4_;
  fVar211 = local_540._16_4_;
  fVar212 = local_540._20_4_;
  fVar213 = local_540._24_4_;
  fVar115 = local_600._0_4_;
  fVar146 = local_600._4_4_;
  fVar21 = local_600._8_4_;
  fVar26 = local_600._12_4_;
  fVar31 = local_600._16_4_;
  fVar36 = local_600._20_4_;
  fVar41 = local_600._24_4_;
  _local_4a0 = vsubps_avx(auVar132,auVar149);
  fVar127 = local_4a0._0_4_;
  fVar16 = local_4a0._4_4_;
  fVar22 = local_4a0._8_4_;
  fVar27 = local_4a0._12_4_;
  fVar32 = local_4a0._16_4_;
  fVar37 = local_4a0._20_4_;
  fVar42 = local_4a0._24_4_;
  fVar219 = fVar142 * fVar127 + fVar208 * fVar115 + fVar201 * fVar202;
  fVar224 = fVar145 * fVar16 + fVar141 * fVar146 + fVar207 * fVar140;
  fVar225 = fVar20 * fVar22 + fVar19 * fVar21 + fVar209 * fVar18;
  fVar226 = fVar25 * fVar27 + fVar24 * fVar26 + fVar210 * fVar23;
  fVar227 = fVar30 * fVar32 + fVar29 * fVar31 + fVar211 * fVar28;
  fVar228 = fVar35 * fVar37 + fVar34 * fVar36 + fVar212 * fVar33;
  fVar229 = fVar40 * fVar42 + fVar39 * fVar41 + fVar213 * fVar38;
  fVar230 = fVar245 + fVar245 + auVar119._28_4_;
  fVar126 = fVar245 + fVar245 + auVar119._28_4_;
  auVar216._0_4_ =
       (float)local_6e0._4_4_ * fVar142 + (float)local_700._4_4_ * fVar208 + local_500 * fVar202;
  auVar216._4_4_ =
       (float)local_6e0._4_4_ * fVar145 + (float)local_700._4_4_ * fVar141 + local_500 * fVar140;
  auVar216._8_4_ =
       (float)local_6e0._4_4_ * fVar20 + (float)local_700._4_4_ * fVar19 + local_500 * fVar18;
  auVar216._12_4_ =
       (float)local_6e0._4_4_ * fVar25 + (float)local_700._4_4_ * fVar24 + local_500 * fVar23;
  auVar216._16_4_ =
       (float)local_6e0._4_4_ * fVar30 + (float)local_700._4_4_ * fVar29 + local_500 * fVar28;
  auVar216._20_4_ =
       (float)local_6e0._4_4_ * fVar35 + (float)local_700._4_4_ * fVar34 + local_500 * fVar33;
  auVar216._24_4_ =
       (float)local_6e0._4_4_ * fVar40 + (float)local_700._4_4_ * fVar39 + local_500 * fVar38;
  auVar216._28_4_ = fVar245 + fVar126;
  local_700._0_4_ = local_700._4_4_;
  fStack_6f8 = (float)local_700._4_4_;
  fStack_6f4 = (float)local_700._4_4_;
  uStack_6f0._0_4_ = (float)local_700._4_4_;
  uStack_6f0._4_4_ = (float)local_700._4_4_;
  uStack_6e8._0_4_ = (float)local_700._4_4_;
  uStack_6e8._4_4_ = local_700._4_4_;
  local_6e0._0_4_ = local_6e0._4_4_;
  fStack_6d8 = (float)local_6e0._4_4_;
  fStack_6d4 = (float)local_6e0._4_4_;
  fStack_6d0 = (float)local_6e0._4_4_;
  fStack_6cc = (float)local_6e0._4_4_;
  fStack_6c8 = (float)local_6e0._4_4_;
  fStack_6c4 = (float)local_6e0._4_4_;
  auVar152 = vsubps_avx(auVar197,auVar91);
  fVar139 = auVar152._0_4_;
  fVar17 = auVar152._4_4_;
  fVar88 = auVar152._8_4_;
  fVar101 = auVar152._12_4_;
  fVar104 = auVar152._16_4_;
  fVar107 = auVar152._20_4_;
  fVar110 = auVar152._24_4_;
  fVar86 = fVar233 + fVar139 * fVar139;
  fVar99 = fVar238 + fVar17 * fVar17;
  fVar102 = fVar239 + fVar88 * fVar88;
  fVar105 = fVar240 + fVar101 * fVar101;
  fVar108 = fVar241 + fVar104 * fVar104;
  fVar111 = fVar242 + fVar107 * fVar107;
  fVar113 = fVar243 + fVar110 * fVar110;
  fVar147 = fVar233 * fVar233;
  fVar154 = fVar238 * fVar238;
  local_240._4_4_ = fVar154;
  local_240._0_4_ = fVar147;
  fVar155 = fVar239 * fVar239;
  fStack_238 = fVar155;
  fVar156 = fVar240 * fVar240;
  fStack_234 = fVar156;
  fVar157 = fVar241 * fVar241;
  fStack_230 = fVar157;
  fVar158 = fVar242 * fVar242;
  fStack_22c = fVar158;
  fVar159 = fVar243 * fVar243;
  fStack_228 = fVar159;
  uStack_224 = auVar149._28_4_;
  auVar205._4_4_ =
       fVar154 * ((float)local_6e0._4_4_ * fVar16 +
                 (float)local_700._4_4_ * fVar146 + local_500 * fVar207);
  auVar205._0_4_ =
       fVar147 * ((float)local_6e0._4_4_ * fVar127 +
                 (float)local_700._4_4_ * fVar115 + local_500 * fVar201);
  auVar205._8_4_ =
       fVar155 * ((float)local_6e0._4_4_ * fVar22 +
                 (float)local_700._4_4_ * fVar21 + local_500 * fVar209);
  auVar205._12_4_ =
       fVar156 * ((float)local_6e0._4_4_ * fVar27 +
                 (float)local_700._4_4_ * fVar26 + local_500 * fVar210);
  auVar205._16_4_ =
       fVar157 * ((float)local_6e0._4_4_ * fVar32 +
                 (float)local_700._4_4_ * fVar31 + local_500 * fVar211);
  auVar205._20_4_ =
       fVar158 * ((float)local_6e0._4_4_ * fVar37 +
                 (float)local_700._4_4_ * fVar36 + local_500 * fVar212);
  auVar205._24_4_ =
       fVar159 * ((float)local_6e0._4_4_ * fVar42 +
                 (float)local_700._4_4_ * fVar41 + local_500 * fVar213);
  auVar205._28_4_ = fVar245 + fVar245 + fVar126;
  fVar126 = local_520._28_4_;
  auVar236._4_4_ = fVar99 * auVar216._4_4_ * fVar224;
  auVar236._0_4_ = fVar86 * auVar216._0_4_ * fVar219;
  auVar236._8_4_ = fVar102 * auVar216._8_4_ * fVar225;
  auVar236._12_4_ = fVar105 * auVar216._12_4_ * fVar226;
  auVar236._16_4_ = fVar108 * auVar216._16_4_ * fVar227;
  auVar236._20_4_ = fVar111 * auVar216._20_4_ * fVar228;
  auVar236._24_4_ = fVar113 * auVar216._24_4_ * fVar229;
  auVar236._28_4_ = fVar126;
  auVar178 = vsubps_avx(auVar205,auVar236);
  fVar172 = auVar197._0_4_ * fVar233;
  fVar181 = auVar197._4_4_ * fVar238;
  auVar246._4_4_ = fVar181;
  auVar246._0_4_ = fVar172;
  fVar182 = auVar197._8_4_ * fVar239;
  auVar246._8_4_ = fVar182;
  fVar183 = auVar197._12_4_ * fVar240;
  auVar246._12_4_ = fVar183;
  fVar184 = auVar197._16_4_ * fVar241;
  auVar246._16_4_ = fVar184;
  fVar185 = auVar197._20_4_ * fVar242;
  auVar246._20_4_ = fVar185;
  fVar186 = auVar197._24_4_ * fVar243;
  auVar246._24_4_ = fVar186;
  auVar246._28_4_ = fVar126;
  auVar120._0_4_ = auVar216._0_4_ * fVar139 * fVar172 + auVar178._0_4_;
  auVar120._4_4_ = auVar216._4_4_ * fVar17 * fVar181 + auVar178._4_4_;
  auVar120._8_4_ = auVar216._8_4_ * fVar88 * fVar182 + auVar178._8_4_;
  auVar120._12_4_ = auVar216._12_4_ * fVar101 * fVar183 + auVar178._12_4_;
  auVar120._16_4_ = auVar216._16_4_ * fVar104 * fVar184 + auVar178._16_4_;
  auVar120._20_4_ = auVar216._20_4_ * fVar107 * fVar185 + auVar178._20_4_;
  auVar120._24_4_ = auVar216._24_4_ * fVar110 * fVar186 + auVar178._24_4_;
  auVar120._28_4_ = (float)local_6e0._4_4_ + auVar178._28_4_;
  auVar48._4_4_ = fVar154 * (fVar16 * fVar16 + fVar146 * fVar146 + fVar207 * fVar207);
  auVar48._0_4_ = fVar147 * (fVar127 * fVar127 + fVar115 * fVar115 + fVar201 * fVar201);
  auVar48._8_4_ = fVar155 * (fVar22 * fVar22 + fVar21 * fVar21 + fVar209 * fVar209);
  auVar48._12_4_ = fVar156 * (fVar27 * fVar27 + fVar26 * fVar26 + fVar210 * fVar210);
  auVar48._16_4_ = fVar157 * (fVar32 * fVar32 + fVar31 * fVar31 + fVar211 * fVar211);
  auVar48._20_4_ = fVar158 * (fVar37 * fVar37 + fVar36 * fVar36 + fVar212 * fVar212);
  auVar48._24_4_ = fVar159 * (fVar42 * fVar42 + fVar41 * fVar41 + fVar213 * fVar213);
  auVar48._28_4_ = auVar149._28_4_ + auVar149._28_4_ + fVar245;
  auVar49._4_4_ = fVar224 * fVar224 * fVar99;
  auVar49._0_4_ = fVar219 * fVar219 * fVar86;
  auVar49._8_4_ = fVar225 * fVar225 * fVar102;
  auVar49._12_4_ = fVar226 * fVar226 * fVar105;
  auVar49._16_4_ = fVar227 * fVar227 * fVar108;
  auVar49._20_4_ = fVar228 * fVar228 * fVar111;
  auVar49._24_4_ = fVar229 * fVar229 * fVar113;
  auVar49._28_4_ = local_6e0._4_4_;
  auVar178 = vsubps_avx(auVar48,auVar49);
  auVar44._4_4_ = (fVar17 + fVar17) * fVar224;
  auVar44._0_4_ = (fVar139 + fVar139) * fVar219;
  auVar44._8_4_ = (fVar88 + fVar88) * fVar225;
  auVar44._12_4_ = (fVar101 + fVar101) * fVar226;
  auVar44._16_4_ = (fVar104 + fVar104) * fVar227;
  auVar44._20_4_ = (fVar107 + fVar107) * fVar228;
  auVar44._24_4_ = (fVar110 + fVar110) * fVar229;
  auVar44._28_4_ = auVar152._28_4_ + auVar152._28_4_;
  auVar152 = vsubps_avx(auVar44,auVar246);
  fVar245 = auVar216._0_4_ * auVar216._0_4_;
  fVar248 = auVar216._4_4_ * auVar216._4_4_;
  fVar249 = auVar216._8_4_ * auVar216._8_4_;
  fVar250 = auVar216._12_4_ * auVar216._12_4_;
  fVar251 = auVar216._16_4_ * auVar216._16_4_;
  fVar252 = auVar216._20_4_ * auVar216._20_4_;
  fVar253 = auVar216._24_4_ * auVar216._24_4_;
  auVar45._4_4_ = fVar248 * fVar99;
  auVar45._0_4_ = fVar245 * fVar86;
  auVar45._8_4_ = fVar249 * fVar102;
  auVar45._12_4_ = fVar250 * fVar105;
  auVar45._16_4_ = fVar251 * fVar108;
  auVar45._20_4_ = fVar252 * fVar111;
  auVar45._24_4_ = fVar253 * fVar113;
  auVar45._28_4_ = fVar126;
  auVar192 = vsubps_avx(_local_240,auVar45);
  auVar46._4_4_ = auVar192._4_4_ * (auVar178._4_4_ + auVar152._4_4_ * fVar181);
  auVar46._0_4_ = auVar192._0_4_ * (auVar178._0_4_ + auVar152._0_4_ * fVar172);
  auVar46._8_4_ = auVar192._8_4_ * (auVar178._8_4_ + auVar152._8_4_ * fVar182);
  auVar46._12_4_ = auVar192._12_4_ * (auVar178._12_4_ + auVar152._12_4_ * fVar183);
  auVar46._16_4_ = auVar192._16_4_ * (auVar178._16_4_ + auVar152._16_4_ * fVar184);
  auVar46._20_4_ = auVar192._20_4_ * (auVar178._20_4_ + auVar152._20_4_ * fVar185);
  auVar46._24_4_ = auVar192._24_4_ * (auVar178._24_4_ + auVar152._24_4_ * fVar186);
  auVar46._28_4_ = auVar178._28_4_ + fVar126;
  auVar47._4_4_ = auVar120._4_4_ * auVar120._4_4_;
  auVar47._0_4_ = auVar120._0_4_ * auVar120._0_4_;
  auVar47._8_4_ = auVar120._8_4_ * auVar120._8_4_;
  auVar47._12_4_ = auVar120._12_4_ * auVar120._12_4_;
  auVar47._16_4_ = auVar120._16_4_ * auVar120._16_4_;
  auVar47._20_4_ = auVar120._20_4_ * auVar120._20_4_;
  auVar47._24_4_ = auVar120._24_4_ * auVar120._24_4_;
  auVar47._28_4_ = fVar126;
  auVar178 = vsubps_avx(auVar47,auVar46);
  auVar152 = vcmpps_avx(auVar178,ZEXT432(0) << 0x20,5);
  auVar205 = auVar152 & ~auVar92;
  if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar205 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar205 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar205 >> 0x7f,0) != '\0') ||
        (auVar205 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar205 >> 0xbf,0) != '\0') ||
      (auVar205 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar205[0x1f] < '\0')
  {
    auVar205 = vandnps_avx(auVar92,auVar152);
    auVar246 = vsubps_avx(auVar132,auVar204);
    auVar48 = vsubps_avx(auVar162,auVar222);
    auVar49 = vsubps_avx(auVar119,auVar235);
    fVar87 = auVar246._0_4_ * fVar142 + auVar48._0_4_ * fVar208 + auVar49._0_4_ * fVar202;
    fVar100 = auVar246._4_4_ * fVar145 + auVar48._4_4_ * fVar141 + auVar49._4_4_ * fVar140;
    fVar103 = auVar246._8_4_ * fVar20 + auVar48._8_4_ * fVar19 + auVar49._8_4_ * fVar18;
    fVar106 = auVar246._12_4_ * fVar25 + auVar48._12_4_ * fVar24 + auVar49._12_4_ * fVar23;
    fVar109 = auVar246._16_4_ * fVar30 + auVar48._16_4_ * fVar29 + auVar49._16_4_ * fVar28;
    fVar112 = auVar246._20_4_ * fVar35 + auVar48._20_4_ * fVar34 + auVar49._20_4_ * fVar33;
    fVar114 = auVar246._24_4_ * fVar40 + auVar48._24_4_ * fVar39 + auVar49._24_4_ * fVar38;
    auVar178 = vsqrtps_avx(auVar178);
    auVar236 = vrcpps_avx(auVar192);
    fVar172 = auVar236._0_4_;
    auVar167._0_4_ = auVar192._0_4_ * fVar172;
    fVar181 = auVar236._4_4_;
    auVar167._4_4_ = auVar192._4_4_ * fVar181;
    fVar182 = auVar236._8_4_;
    auVar167._8_4_ = auVar192._8_4_ * fVar182;
    fVar183 = auVar236._12_4_;
    auVar167._12_4_ = auVar192._12_4_ * fVar183;
    fVar184 = auVar236._16_4_;
    auVar167._16_4_ = auVar192._16_4_ * fVar184;
    fVar185 = auVar236._20_4_;
    auVar167._20_4_ = auVar192._20_4_ * fVar185;
    fVar186 = auVar236._24_4_;
    auVar167._24_4_ = auVar192._24_4_ * fVar186;
    auVar167._28_4_ = 0;
    auVar231._8_4_ = 0x3f800000;
    auVar231._0_8_ = 0x3f8000003f800000;
    auVar231._12_4_ = 0x3f800000;
    auVar231._16_4_ = 0x3f800000;
    auVar231._20_4_ = 0x3f800000;
    auVar231._24_4_ = 0x3f800000;
    auVar231._28_4_ = 0x3f800000;
    auVar44 = vsubps_avx(auVar231,auVar167);
    auVar175._8_4_ = 0x7fffffff;
    auVar175._0_8_ = 0x7fffffff7fffffff;
    auVar175._12_4_ = 0x7fffffff;
    auVar175._16_4_ = 0x7fffffff;
    auVar175._20_4_ = 0x7fffffff;
    auVar175._24_4_ = 0x7fffffff;
    auVar175._28_4_ = 0x7fffffff;
    fVar172 = fVar172 + fVar172 * auVar44._0_4_;
    fVar181 = fVar181 + fVar181 * auVar44._4_4_;
    fVar182 = fVar182 + fVar182 * auVar44._8_4_;
    fVar183 = fVar183 + fVar183 * auVar44._12_4_;
    fVar184 = fVar184 + fVar184 * auVar44._16_4_;
    fVar185 = fVar185 + fVar185 * auVar44._20_4_;
    fVar186 = fVar186 + fVar186 * auVar44._24_4_;
    auVar152 = vandps_avx(auVar192,auVar175);
    auVar188._8_4_ = 0x219392ef;
    auVar188._0_8_ = 0x219392ef219392ef;
    auVar188._12_4_ = 0x219392ef;
    auVar188._16_4_ = 0x219392ef;
    auVar188._20_4_ = 0x219392ef;
    auVar188._24_4_ = 0x219392ef;
    auVar188._28_4_ = 0x219392ef;
    auVar152 = vcmpps_avx(auVar152,auVar188,2);
    uVar85 = CONCAT44(auVar120._4_4_,auVar120._0_4_);
    auVar189._0_8_ = uVar85 ^ 0x8000000080000000;
    auVar189._8_4_ = -auVar120._8_4_;
    auVar189._12_4_ = -auVar120._12_4_;
    auVar189._16_4_ = -auVar120._16_4_;
    auVar189._20_4_ = -auVar120._20_4_;
    auVar189._24_4_ = -auVar120._24_4_;
    auVar189._28_4_ = -auVar120._28_4_;
    auVar192 = vsubps_avx(auVar189,auVar178);
    auVar45 = vsubps_avx(auVar178,auVar120);
    auVar50._4_4_ = auVar192._4_4_ * fVar181;
    auVar50._0_4_ = auVar192._0_4_ * fVar172;
    auVar50._8_4_ = auVar192._8_4_ * fVar182;
    auVar50._12_4_ = auVar192._12_4_ * fVar183;
    auVar50._16_4_ = auVar192._16_4_ * fVar184;
    auVar50._20_4_ = auVar192._20_4_ * fVar185;
    auVar50._24_4_ = auVar192._24_4_ * fVar186;
    auVar50._28_4_ = auVar178._28_4_;
    auVar51._4_4_ = auVar45._4_4_ * fVar181;
    auVar51._0_4_ = auVar45._0_4_ * fVar172;
    auVar51._8_4_ = auVar45._8_4_ * fVar182;
    auVar51._12_4_ = auVar45._12_4_ * fVar183;
    auVar51._16_4_ = auVar45._16_4_ * fVar184;
    auVar51._20_4_ = auVar45._20_4_ * fVar185;
    auVar51._24_4_ = auVar45._24_4_ * fVar186;
    auVar51._28_4_ = auVar45._28_4_;
    auVar93._8_4_ = 0xff800000;
    auVar93._0_8_ = 0xff800000ff800000;
    auVar93._12_4_ = 0xff800000;
    auVar93._16_4_ = 0xff800000;
    auVar93._20_4_ = 0xff800000;
    auVar93._24_4_ = 0xff800000;
    auVar93._28_4_ = 0xff800000;
    auVar178 = vblendvps_avx(auVar50,auVar93,auVar152);
    auVar150._8_4_ = 0x7f800000;
    auVar150._0_8_ = 0x7f8000007f800000;
    auVar150._12_4_ = 0x7f800000;
    auVar150._16_4_ = 0x7f800000;
    auVar150._20_4_ = 0x7f800000;
    auVar150._24_4_ = 0x7f800000;
    auVar150._28_4_ = 0x7f800000;
    auVar192 = vblendvps_avx(auVar51,auVar150,auVar152);
    auVar176._0_4_ = fVar219 + auVar216._0_4_ * auVar178._0_4_;
    auVar176._4_4_ = fVar224 + auVar216._4_4_ * auVar178._4_4_;
    auVar176._8_4_ = fVar225 + auVar216._8_4_ * auVar178._8_4_;
    auVar176._12_4_ = fVar226 + auVar216._12_4_ * auVar178._12_4_;
    auVar176._16_4_ = fVar227 + auVar216._16_4_ * auVar178._16_4_;
    auVar176._20_4_ = fVar228 + auVar216._20_4_ * auVar178._20_4_;
    auVar176._24_4_ = fVar229 + auVar216._24_4_ * auVar178._24_4_;
    auVar176._28_4_ = fVar230 + auVar236._28_4_ + auVar44._28_4_;
    auVar152 = vcmpps_avx(auVar176,ZEXT832(0) << 0x20,6);
    auVar78._4_4_ = fVar238;
    auVar78._0_4_ = fVar233;
    auVar78._8_4_ = fVar239;
    auVar78._12_4_ = fVar240;
    auVar78._16_4_ = fVar241;
    auVar78._20_4_ = fVar242;
    auVar78._24_4_ = fVar243;
    auVar78._28_4_ = fVar244;
    auVar236 = vcmpps_avx(auVar176,auVar78,1);
    auVar152 = vandps_avx(auVar236,auVar152);
    auVar152 = vandps_avx(auVar205,auVar152);
    local_3a0 = vblendvps_avx(auVar150,auVar178,auVar152);
    local_3c0._0_4_ = fVar219 + auVar216._0_4_ * auVar192._0_4_;
    local_3c0._4_4_ = fVar224 + auVar216._4_4_ * auVar192._4_4_;
    fStack_3b8 = fVar225 + auVar216._8_4_ * auVar192._8_4_;
    fStack_3b4 = fVar226 + auVar216._12_4_ * auVar192._12_4_;
    fStack_3b0 = fVar227 + auVar216._16_4_ * auVar192._16_4_;
    fStack_3ac = fVar228 + auVar216._20_4_ * auVar192._20_4_;
    fStack_3a8 = fVar229 + auVar216._24_4_ * auVar192._24_4_;
    register0x0000139c = fVar230 + local_3a0._28_4_;
    auVar152 = vcmpps_avx(_local_3c0,ZEXT832(0) << 0x20,6);
    auVar178 = vcmpps_avx(_local_3c0,auVar78,1);
    auVar152 = vandps_avx(auVar178,auVar152);
    auVar152 = vandps_avx(auVar205,auVar152);
    local_5a0 = vblendvps_avx(auVar93,auVar192,auVar152);
    auVar192 = vrcpps_avx(auVar216);
    fVar172 = auVar192._0_4_;
    fVar181 = auVar192._4_4_;
    auVar52._4_4_ = auVar216._4_4_ * fVar181;
    auVar52._0_4_ = auVar216._0_4_ * fVar172;
    fVar182 = auVar192._8_4_;
    auVar52._8_4_ = auVar216._8_4_ * fVar182;
    fVar183 = auVar192._12_4_;
    auVar52._12_4_ = auVar216._12_4_ * fVar183;
    fVar184 = auVar192._16_4_;
    auVar52._16_4_ = auVar216._16_4_ * fVar184;
    fVar185 = auVar192._20_4_;
    auVar52._20_4_ = auVar216._20_4_ * fVar185;
    fVar186 = auVar192._24_4_;
    auVar52._24_4_ = auVar216._24_4_ * fVar186;
    auVar52._28_4_ = auVar152._28_4_;
    auVar44 = vsubps_avx(auVar231,auVar52);
    fVar172 = fVar172 + fVar172 * auVar44._0_4_;
    fVar181 = fVar181 + fVar181 * auVar44._4_4_;
    fVar182 = fVar182 + fVar182 * auVar44._8_4_;
    fVar183 = fVar183 + fVar183 * auVar44._12_4_;
    fVar184 = fVar184 + fVar184 * auVar44._16_4_;
    fVar185 = fVar185 + fVar185 * auVar44._20_4_;
    fVar186 = fVar186 + fVar186 * auVar44._24_4_;
    auVar53._4_4_ = auVar216._4_4_ * fVar16;
    auVar53._0_4_ = auVar216._0_4_ * fVar127;
    auVar53._8_4_ = auVar216._8_4_ * fVar22;
    auVar53._12_4_ = auVar216._12_4_ * fVar27;
    auVar53._16_4_ = auVar216._16_4_ * fVar32;
    auVar53._20_4_ = auVar216._20_4_ * fVar37;
    auVar53._24_4_ = auVar216._24_4_ * fVar42;
    auVar53._28_4_ = auVar44._28_4_;
    auVar54._4_4_ = (float)local_6e0._4_4_ * fVar224;
    auVar54._0_4_ = (float)local_6e0._4_4_ * fVar219;
    auVar54._8_4_ = (float)local_6e0._4_4_ * fVar225;
    auVar54._12_4_ = (float)local_6e0._4_4_ * fVar226;
    auVar54._16_4_ = (float)local_6e0._4_4_ * fVar227;
    auVar54._20_4_ = (float)local_6e0._4_4_ * fVar228;
    auVar54._24_4_ = (float)local_6e0._4_4_ * fVar229;
    auVar54._28_4_ = auVar178._28_4_;
    auVar152 = vsubps_avx(auVar53,auVar54);
    auVar55._4_4_ = auVar216._4_4_ * fVar146;
    auVar55._0_4_ = auVar216._0_4_ * fVar115;
    auVar55._8_4_ = auVar216._8_4_ * fVar21;
    auVar55._12_4_ = auVar216._12_4_ * fVar26;
    auVar55._16_4_ = auVar216._16_4_ * fVar31;
    auVar55._20_4_ = auVar216._20_4_ * fVar36;
    auVar55._24_4_ = auVar216._24_4_ * fVar41;
    auVar55._28_4_ = auVar178._28_4_;
    auVar56._4_4_ = fVar224 * (float)local_700._4_4_;
    auVar56._0_4_ = fVar219 * (float)local_700._4_4_;
    auVar56._8_4_ = fVar225 * (float)local_700._4_4_;
    auVar56._12_4_ = fVar226 * (float)local_700._4_4_;
    auVar56._16_4_ = fVar227 * (float)local_700._4_4_;
    auVar56._20_4_ = fVar228 * (float)local_700._4_4_;
    auVar56._24_4_ = fVar229 * (float)local_700._4_4_;
    auVar56._28_4_ = auVar236._28_4_;
    auVar178 = vsubps_avx(auVar55,auVar56);
    auVar57._4_4_ = auVar216._4_4_ * fVar207;
    auVar57._0_4_ = auVar216._0_4_ * fVar201;
    auVar57._8_4_ = auVar216._8_4_ * fVar209;
    auVar57._12_4_ = auVar216._12_4_ * fVar210;
    auVar57._16_4_ = auVar216._16_4_ * fVar211;
    auVar57._20_4_ = auVar216._20_4_ * fVar212;
    auVar57._24_4_ = auVar216._24_4_ * fVar213;
    auVar57._28_4_ = auVar236._28_4_;
    auVar198._0_4_ = local_500 * fVar219;
    auVar198._4_4_ = local_500 * fVar224;
    auVar198._8_4_ = local_500 * fVar225;
    auVar198._12_4_ = local_500 * fVar226;
    auVar198._16_4_ = local_500 * fVar227;
    auVar198._20_4_ = local_500 * fVar228;
    auVar198._24_4_ = local_500 * fVar229;
    auVar198._28_4_ = 0;
    auVar236 = vsubps_avx(auVar57,auVar198);
    fVar58 = auVar236._28_4_;
    fVar171 = auVar178._28_4_ + fVar58;
    auVar133._0_4_ =
         auVar152._0_4_ * auVar152._0_4_ +
         auVar178._0_4_ * auVar178._0_4_ + auVar236._0_4_ * auVar236._0_4_;
    auVar133._4_4_ =
         auVar152._4_4_ * auVar152._4_4_ +
         auVar178._4_4_ * auVar178._4_4_ + auVar236._4_4_ * auVar236._4_4_;
    auVar133._8_4_ =
         auVar152._8_4_ * auVar152._8_4_ +
         auVar178._8_4_ * auVar178._8_4_ + auVar236._8_4_ * auVar236._8_4_;
    auVar133._12_4_ =
         auVar152._12_4_ * auVar152._12_4_ +
         auVar178._12_4_ * auVar178._12_4_ + auVar236._12_4_ * auVar236._12_4_;
    auVar133._16_4_ =
         auVar152._16_4_ * auVar152._16_4_ +
         auVar178._16_4_ * auVar178._16_4_ + auVar236._16_4_ * auVar236._16_4_;
    auVar133._20_4_ =
         auVar152._20_4_ * auVar152._20_4_ +
         auVar178._20_4_ * auVar178._20_4_ + auVar236._20_4_ * auVar236._20_4_;
    auVar133._24_4_ =
         auVar152._24_4_ * auVar152._24_4_ +
         auVar178._24_4_ * auVar178._24_4_ + auVar236._24_4_ * auVar236._24_4_;
    auVar133._28_4_ = auVar152._28_4_ + fVar171;
    auVar59._4_4_ = fVar248 * auVar197._4_4_ * auVar197._4_4_;
    auVar59._0_4_ = fVar245 * auVar197._0_4_ * auVar197._0_4_;
    auVar59._8_4_ = fVar249 * auVar197._8_4_ * auVar197._8_4_;
    auVar59._12_4_ = fVar250 * auVar197._12_4_ * auVar197._12_4_;
    auVar59._16_4_ = fVar251 * auVar197._16_4_ * auVar197._16_4_;
    auVar59._20_4_ = fVar252 * auVar197._20_4_ * auVar197._20_4_;
    auVar59._24_4_ = fVar253 * auVar197._24_4_ * auVar197._24_4_;
    auVar59._28_4_ = fVar171;
    auVar152 = vcmpps_avx(auVar133,auVar59,1);
    auVar60._4_4_ = fVar181 * -fVar224;
    auVar60._0_4_ = fVar172 * -fVar219;
    auVar60._8_4_ = fVar182 * -fVar225;
    auVar60._12_4_ = fVar183 * -fVar226;
    auVar60._16_4_ = fVar184 * -fVar227;
    auVar60._20_4_ = fVar185 * -fVar228;
    auVar60._24_4_ = fVar186 * -fVar229;
    auVar60._28_4_ = -fVar230;
    auVar178 = vblendvps_avx(auVar150,auVar60,auVar152);
    auVar168._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar168._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->leftExists & 0xf) << 4));
    auVar152 = vandnps_avx(auVar168,auVar205);
    local_560 = vblendvps_avx(auVar150,auVar178,auVar152);
    auVar134._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar134._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar61._4_4_ = auVar216._4_4_ * auVar246._4_4_;
    auVar61._0_4_ = auVar216._0_4_ * auVar246._0_4_;
    auVar61._8_4_ = auVar216._8_4_ * auVar246._8_4_;
    auVar61._12_4_ = auVar216._12_4_ * auVar246._12_4_;
    auVar61._16_4_ = auVar216._16_4_ * auVar246._16_4_;
    auVar61._20_4_ = auVar216._20_4_ * auVar246._20_4_;
    auVar61._24_4_ = auVar216._24_4_ * auVar246._24_4_;
    auVar61._28_4_ = 0;
    auVar62._4_4_ = auVar216._4_4_ * auVar48._4_4_;
    auVar62._0_4_ = auVar216._0_4_ * auVar48._0_4_;
    auVar62._8_4_ = auVar216._8_4_ * auVar48._8_4_;
    auVar62._12_4_ = auVar216._12_4_ * auVar48._12_4_;
    auVar62._16_4_ = auVar216._16_4_ * auVar48._16_4_;
    auVar62._20_4_ = auVar216._20_4_ * auVar48._20_4_;
    auVar62._24_4_ = auVar216._24_4_ * auVar48._24_4_;
    auVar62._28_4_ = auVar152._28_4_;
    auVar63._4_4_ = auVar216._4_4_ * auVar49._4_4_;
    auVar63._0_4_ = auVar216._0_4_ * auVar49._0_4_;
    auVar63._8_4_ = auVar216._8_4_ * auVar49._8_4_;
    auVar63._12_4_ = auVar216._12_4_ * auVar49._12_4_;
    auVar63._16_4_ = auVar216._16_4_ * auVar49._16_4_;
    auVar63._20_4_ = auVar216._20_4_ * auVar49._20_4_;
    auVar63._24_4_ = auVar216._24_4_ * auVar49._24_4_;
    auVar63._28_4_ = 0;
    auVar64._4_4_ = (float)local_6e0._4_4_ * fVar100;
    auVar64._0_4_ = (float)local_6e0._4_4_ * fVar87;
    auVar64._8_4_ = (float)local_6e0._4_4_ * fVar103;
    auVar64._12_4_ = (float)local_6e0._4_4_ * fVar106;
    auVar64._16_4_ = (float)local_6e0._4_4_ * fVar109;
    auVar64._20_4_ = (float)local_6e0._4_4_ * fVar112;
    auVar64._24_4_ = (float)local_6e0._4_4_ * fVar114;
    auVar64._28_4_ = fVar58;
    auVar152 = vsubps_avx(auVar61,auVar64);
    auVar65._4_4_ = fVar100 * (float)local_700._4_4_;
    auVar65._0_4_ = fVar87 * (float)local_700._4_4_;
    auVar65._8_4_ = fVar103 * (float)local_700._4_4_;
    auVar65._12_4_ = fVar106 * (float)local_700._4_4_;
    auVar65._16_4_ = fVar109 * (float)local_700._4_4_;
    auVar65._20_4_ = fVar112 * (float)local_700._4_4_;
    auVar65._24_4_ = fVar114 * (float)local_700._4_4_;
    auVar65._28_4_ = fVar58;
    auVar178 = vsubps_avx(auVar62,auVar65);
    auVar66._4_4_ = local_500 * fVar100;
    auVar66._0_4_ = local_500 * fVar87;
    auVar66._8_4_ = local_500 * fVar103;
    auVar66._12_4_ = local_500 * fVar106;
    auVar66._16_4_ = local_500 * fVar109;
    auVar66._20_4_ = local_500 * fVar112;
    auVar66._24_4_ = local_500 * fVar114;
    auVar66._28_4_ = fVar58;
    auVar236 = vsubps_avx(auVar63,auVar66);
    auVar94._0_4_ =
         auVar152._0_4_ * auVar152._0_4_ +
         auVar178._0_4_ * auVar178._0_4_ + auVar236._0_4_ * auVar236._0_4_;
    auVar94._4_4_ =
         auVar152._4_4_ * auVar152._4_4_ +
         auVar178._4_4_ * auVar178._4_4_ + auVar236._4_4_ * auVar236._4_4_;
    auVar94._8_4_ =
         auVar152._8_4_ * auVar152._8_4_ +
         auVar178._8_4_ * auVar178._8_4_ + auVar236._8_4_ * auVar236._8_4_;
    auVar94._12_4_ =
         auVar152._12_4_ * auVar152._12_4_ +
         auVar178._12_4_ * auVar178._12_4_ + auVar236._12_4_ * auVar236._12_4_;
    auVar94._16_4_ =
         auVar152._16_4_ * auVar152._16_4_ +
         auVar178._16_4_ * auVar178._16_4_ + auVar236._16_4_ * auVar236._16_4_;
    auVar94._20_4_ =
         auVar152._20_4_ * auVar152._20_4_ +
         auVar178._20_4_ * auVar178._20_4_ + auVar236._20_4_ * auVar236._20_4_;
    auVar94._24_4_ =
         auVar152._24_4_ * auVar152._24_4_ +
         auVar178._24_4_ * auVar178._24_4_ + auVar236._24_4_ * auVar236._24_4_;
    auVar94._28_4_ = auVar152._28_4_ + auVar178._28_4_ + auVar236._28_4_;
    auVar67._4_4_ = fVar248 * auVar89._4_4_ * auVar89._4_4_;
    auVar67._0_4_ = fVar245 * auVar89._0_4_ * auVar89._0_4_;
    auVar67._8_4_ = fVar249 * auVar89._8_4_ * auVar89._8_4_;
    auVar67._12_4_ = fVar250 * auVar89._12_4_ * auVar89._12_4_;
    auVar67._16_4_ = fVar251 * auVar91._16_4_ * auVar91._16_4_;
    auVar67._20_4_ = fVar252 * auVar91._20_4_ * auVar91._20_4_;
    auVar67._24_4_ = fVar253 * auVar91._24_4_ * auVar91._24_4_;
    auVar67._28_4_ = auVar91._28_4_;
    auVar178 = vcmpps_avx(auVar94,auVar67,1);
    auVar90 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x60)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0);
    auVar152 = vandnps_avx(auVar134,auVar205);
    auVar68._4_4_ = fVar181 * -fVar100;
    auVar68._0_4_ = fVar172 * -fVar87;
    auVar68._8_4_ = fVar182 * -fVar103;
    auVar68._12_4_ = fVar183 * -fVar106;
    auVar68._16_4_ = fVar184 * -fVar109;
    auVar68._20_4_ = fVar185 * -fVar112;
    auVar68._24_4_ = fVar186 * -fVar114;
    auVar68._28_4_ = auVar192._28_4_ + auVar44._28_4_;
    auVar177._8_4_ = 0x7f800000;
    auVar177._0_8_ = 0x7f8000007f800000;
    auVar177._12_4_ = 0x7f800000;
    auVar177._16_4_ = 0x7f800000;
    auVar177._20_4_ = 0x7f800000;
    auVar177._24_4_ = 0x7f800000;
    auVar177._28_4_ = 0x7f800000;
    auVar178 = vblendvps_avx(auVar177,auVar68,auVar178);
    auVar152 = vblendvps_avx(auVar177,auVar178,auVar152);
    auVar192 = vmaxps_avx(local_560,auVar152);
    auVar178 = vcmpps_avx(auVar192,auVar177,0);
    auVar190._8_4_ = 0xff800000;
    auVar190._0_8_ = 0xff800000ff800000;
    auVar190._12_4_ = 0xff800000;
    auVar190._16_4_ = 0xff800000;
    auVar190._20_4_ = 0xff800000;
    auVar190._24_4_ = 0xff800000;
    auVar190._28_4_ = 0xff800000;
    auVar178 = vblendvps_avx(auVar192,auVar190,auVar178);
    auVar192 = vminps_avx(local_560,auVar152);
    auVar152 = vcmpps_avx(auVar192,auVar177,0);
    auVar152 = vblendvps_avx(auVar192,auVar190,auVar152);
    auVar236 = vminps_avx(local_3a0,auVar192);
    auVar192 = vcmpps_avx(auVar236,auVar192,0);
    auVar152 = vblendvps_avx(auVar152,auVar178,auVar192);
    auVar135._16_16_ = auVar90;
    auVar135._0_16_ = auVar90;
    local_2e0 = vmaxps_avx(local_5a0,auVar152);
    auVar121._0_4_ = fVar116 + auVar236._0_4_;
    auVar121._4_4_ = fVar125 + auVar236._4_4_;
    auVar121._8_4_ = fStack_698 + auVar236._8_4_;
    auVar121._12_4_ = fStack_694 + auVar236._12_4_;
    auVar121._16_4_ = fStack_690 + auVar236._16_4_;
    auVar121._20_4_ = fStack_68c + auVar236._20_4_;
    auVar121._24_4_ = fStack_688 + auVar236._24_4_;
    auVar121._28_4_ = fStack_684 + auVar236._28_4_;
    auVar152 = vcmpps_avx(auVar135,auVar121,2);
    auVar90 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x100)),0);
    auVar144._16_16_ = auVar90;
    auVar144._0_16_ = auVar90;
    auVar178 = vcmpps_avx(auVar121,auVar144,2);
    auVar152 = vandps_avx(auVar178,auVar152);
    auVar178 = vcmpps_avx(auVar177,auVar236,4);
    auVar178 = vandps_avx(auVar205,auVar178);
    local_4c0 = vandps_avx(auVar152,auVar178);
    local_620._0_4_ = fVar116 + local_2e0._0_4_;
    local_620._4_4_ = fVar125 + local_2e0._4_4_;
    local_620._8_4_ = fStack_698 + local_2e0._8_4_;
    local_620._12_4_ = fStack_694 + local_2e0._12_4_;
    local_620._16_4_ = fStack_690 + local_2e0._16_4_;
    local_620._20_4_ = fStack_68c + local_2e0._20_4_;
    local_620._24_4_ = fStack_688 + local_2e0._24_4_;
    fStack_284 = local_2e0._28_4_;
    local_620._28_4_ = fStack_684 + fStack_284;
    auVar152 = vcmpps_avx(auVar135,local_620,2);
    auVar178 = vcmpps_avx(local_620,auVar144,2);
    auVar152 = vandps_avx(auVar178,auVar152);
    auVar178 = vcmpps_avx(auVar190,local_2e0,4);
    auVar178 = vandps_avx(auVar205,auVar178);
    local_4e0 = vandps_avx(auVar152,auVar178);
    local_660 = vorps_avx(local_4c0,local_4e0);
    if ((((((((local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_660 >> 0x7f,0) != '\0') ||
          (local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_660 >> 0xbf,0) != '\0') ||
        (local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_660[0x1f] < '\0') {
      auVar192 = vblendvps_avx(local_2e0,auVar236,local_4c0);
      auVar236 = vblendvps_avx(_local_3c0,auVar176,local_4c0);
      auVar79._4_4_ = fVar238;
      auVar79._0_4_ = fVar233;
      auVar79._8_4_ = fVar239;
      auVar79._12_4_ = fVar240;
      auVar79._16_4_ = fVar241;
      auVar79._20_4_ = fVar242;
      auVar79._24_4_ = fVar243;
      auVar79._28_4_ = fVar244;
      auVar152 = vrcpps_avx(auVar79);
      local_5c0 = auVar152._0_4_;
      fStack_5bc = auVar152._4_4_;
      auVar69._4_4_ = fVar238 * fStack_5bc;
      auVar69._0_4_ = fVar233 * local_5c0;
      fStack_5b8 = auVar152._8_4_;
      auVar69._8_4_ = fVar239 * fStack_5b8;
      fStack_5b4 = auVar152._12_4_;
      auVar69._12_4_ = fVar240 * fStack_5b4;
      fStack_5b0 = auVar152._16_4_;
      auVar69._16_4_ = fVar241 * fStack_5b0;
      fStack_5ac = auVar152._20_4_;
      auVar69._20_4_ = fVar242 * fStack_5ac;
      fStack_5a8 = auVar152._24_4_;
      auVar69._24_4_ = fVar243 * fStack_5a8;
      auVar69._28_4_ = local_620._28_4_;
      auVar223._8_4_ = 0x3f800000;
      auVar223._0_8_ = 0x3f8000003f800000;
      auVar223._12_4_ = 0x3f800000;
      auVar223._16_4_ = 0x3f800000;
      auVar223._20_4_ = 0x3f800000;
      auVar223._24_4_ = 0x3f800000;
      auVar223._28_4_ = 0x3f800000;
      auVar178 = vsubps_avx(auVar223,auVar69);
      local_5c0 = local_5c0 + local_5c0 * auVar178._0_4_;
      fStack_5bc = fStack_5bc + fStack_5bc * auVar178._4_4_;
      fStack_5b8 = fStack_5b8 + fStack_5b8 * auVar178._8_4_;
      fStack_5b4 = fStack_5b4 + fStack_5b4 * auVar178._12_4_;
      fStack_5b0 = fStack_5b0 + fStack_5b0 * auVar178._16_4_;
      fStack_5ac = fStack_5ac + fStack_5ac * auVar178._20_4_;
      fStack_5a8 = fStack_5a8 + fStack_5a8 * auVar178._24_4_;
      fStack_5a4 = auVar152._28_4_ + auVar178._28_4_;
      fVar182 = fVar233 * fVar139 * auVar197._0_4_;
      fVar183 = fVar238 * fVar17 * auVar197._4_4_;
      fVar184 = fVar239 * fVar88 * auVar197._8_4_;
      fVar185 = fVar240 * fVar101 * auVar197._12_4_;
      fVar186 = fVar241 * fVar104 * auVar197._16_4_;
      fVar219 = fVar242 * fVar107 * auVar197._20_4_;
      fVar224 = fVar243 * fVar110 * auVar197._24_4_;
      local_580 = fVar208 * fVar86;
      fStack_57c = fVar141 * fVar99;
      fStack_578 = fVar19 * fVar102;
      fStack_574 = fVar24 * fVar105;
      fStack_570 = fVar29 * fVar108;
      fStack_56c = fVar34 * fVar111;
      fStack_568 = fVar39 * fVar113;
      auVar152 = vcmpps_avx(auVar192,local_3a0,0);
      auVar178 = vcmpps_avx(auVar192,local_5a0,0);
      auVar152 = vorps_avx(auVar152,auVar178);
      auVar152 = vandps_avx(auVar205,auVar152);
      auVar246 = vcmpps_avx(local_560,auVar192,0);
      auVar178 = vandps_avx(auVar205,auVar246);
      fVar88 = auVar192._0_4_;
      fVar101 = auVar192._4_4_;
      fVar104 = auVar192._8_4_;
      fVar107 = auVar192._12_4_;
      fVar110 = auVar192._16_4_;
      fVar172 = auVar192._20_4_;
      fVar181 = auVar192._24_4_;
      fStack_2bc = fVar145 * fVar183;
      local_2c0 = fVar142 * fVar182;
      fStack_2b8 = fVar20 * fVar184;
      fStack_2b4 = fVar25 * fVar185;
      fStack_2b0 = fVar30 * fVar186;
      fStack_2ac = fVar35 * fVar219;
      fStack_2a8 = fVar40 * fVar224;
      fStack_2a4 = fStack_684;
      auVar136._0_4_ = fVar142 * fVar182 + fVar147 * (fVar88 * (float)local_6e0._4_4_ + fVar127);
      auVar136._4_4_ = fVar145 * fVar183 + fVar154 * (fVar101 * (float)local_6e0._4_4_ + fVar16);
      auVar136._8_4_ = fVar20 * fVar184 + fVar155 * (fVar104 * (float)local_6e0._4_4_ + fVar22);
      auVar136._12_4_ = fVar25 * fVar185 + fVar156 * (fVar107 * (float)local_6e0._4_4_ + fVar27);
      auVar136._16_4_ = fVar30 * fVar186 + fVar157 * (fVar110 * (float)local_6e0._4_4_ + fVar32);
      auVar136._20_4_ = fVar35 * fVar219 + fVar158 * (fVar172 * (float)local_6e0._4_4_ + fVar37);
      auVar136._24_4_ = fVar40 * fVar224 + fVar159 * (fVar181 * (float)local_6e0._4_4_ + fVar42);
      auVar136._28_4_ = fStack_684 + auVar246._28_4_ + fStack_484;
      fStack_31c = fVar145 * fVar99;
      local_320 = fVar142 * fVar86;
      fStack_318 = fVar20 * fVar102;
      fStack_314 = fVar25 * fVar105;
      fStack_310 = fVar30 * fVar108;
      fStack_30c = fVar35 * fVar111;
      fStack_308 = fVar40 * fVar113;
      uStack_304 = local_4c0._28_4_;
      fVar245 = auVar236._0_4_;
      fVar127 = auVar236._4_4_;
      auVar70._4_4_ = fVar145 * fVar99 * fVar127;
      auVar70._0_4_ = fVar142 * fVar86 * fVar245;
      fVar142 = auVar236._8_4_;
      auVar70._8_4_ = fVar20 * fVar102 * fVar142;
      fVar139 = auVar236._12_4_;
      auVar70._12_4_ = fVar25 * fVar105 * fVar139;
      fVar145 = auVar236._16_4_;
      auVar70._16_4_ = fVar30 * fVar108 * fVar145;
      fVar16 = auVar236._20_4_;
      auVar70._20_4_ = fVar35 * fVar111 * fVar16;
      fVar17 = auVar236._24_4_;
      auVar70._24_4_ = fVar40 * fVar113 * fVar17;
      auVar70._28_4_ = fStack_684;
      auVar246 = vsubps_avx(auVar136,auVar70);
      fStack_2fc = fVar141 * fVar183;
      local_300 = fVar208 * fVar182;
      fStack_2f8 = fVar19 * fVar184;
      fStack_2f4 = fVar24 * fVar185;
      fStack_2f0 = fVar29 * fVar186;
      fStack_2ec = fVar34 * fVar219;
      fStack_2e8 = fVar39 * fVar224;
      fStack_2e4 = (float)local_6e0._4_4_;
      auVar191._0_4_ = fVar208 * fVar182 + fVar147 * (fVar88 * (float)local_700._4_4_ + fVar115);
      auVar191._4_4_ = fVar141 * fVar183 + fVar154 * (fVar101 * (float)local_700._4_4_ + fVar146);
      auVar191._8_4_ = fVar19 * fVar184 + fVar155 * (fVar104 * (float)local_700._4_4_ + fVar21);
      auVar191._12_4_ = fVar24 * fVar185 + fVar156 * (fVar107 * (float)local_700._4_4_ + fVar26);
      auVar191._16_4_ = fVar29 * fVar186 + fVar157 * (fVar110 * (float)local_700._4_4_ + fVar31);
      auVar191._20_4_ = fVar34 * fVar219 + fVar158 * (fVar172 * (float)local_700._4_4_ + fVar36);
      auVar191._24_4_ = fVar39 * fVar224 + fVar159 * (fVar181 * (float)local_700._4_4_ + fVar41);
      auVar191._28_4_ = (float)local_6e0._4_4_ + fStack_684 + uStack_5e8._4_4_;
      uStack_564 = 0xff800000;
      auVar71._4_4_ = fStack_57c * fVar127;
      auVar71._0_4_ = local_580 * fVar245;
      auVar71._8_4_ = fStack_578 * fVar142;
      auVar71._12_4_ = fStack_574 * fVar139;
      auVar71._16_4_ = fStack_570 * fVar145;
      auVar71._20_4_ = fStack_56c * fVar16;
      auVar71._24_4_ = fStack_568 * fVar17;
      auVar71._28_4_ = local_4c0._28_4_;
      auVar48 = vsubps_avx(auVar191,auVar71);
      local_c0._0_8_ = local_680._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar20;
      local_c0._12_4_ = -fVar25;
      local_c0._16_4_ = -fVar30;
      local_c0._20_4_ = -fVar35;
      local_c0._24_4_ = -fVar40;
      local_c0._28_4_ = -local_680._28_4_;
      auVar205 = vblendvps_avx(local_680,local_c0,auVar178);
      local_420 = vblendvps_avx(auVar205,auVar246,auVar152);
      auVar247 = ZEXT3264(local_520);
      auVar237 = ZEXT3264(local_540);
      local_80 = fVar202 * fVar182;
      fStack_7c = fVar140 * fVar183;
      fStack_78 = fVar18 * fVar184;
      fStack_74 = fVar23 * fVar185;
      fStack_70 = fVar28 * fVar186;
      fStack_6c = fVar33 * fVar219;
      fStack_68 = fVar38 * fVar224;
      fStack_64 = auVar205._28_4_;
      auVar151._0_4_ = fVar202 * fVar182 + fVar147 * (fVar201 + local_500 * fVar88);
      auVar151._4_4_ = fVar140 * fVar183 + fVar154 * (fVar207 + local_500 * fVar101);
      auVar151._8_4_ = fVar18 * fVar184 + fVar155 * (fVar209 + local_500 * fVar104);
      auVar151._12_4_ = fVar23 * fVar185 + fVar156 * (fVar210 + local_500 * fVar107);
      auVar151._16_4_ = fVar28 * fVar186 + fVar157 * (fVar211 + local_500 * fVar110);
      auVar151._20_4_ = fVar33 * fVar219 + fVar158 * (fVar212 + local_500 * fVar172);
      auVar151._24_4_ = fVar38 * fVar224 + fVar159 * (fVar213 + local_500 * fVar181);
      auVar151._28_4_ = auVar205._28_4_ + local_540._28_4_ + local_c0._28_4_;
      local_2a0 = fVar202 * fVar86;
      fStack_29c = fVar140 * fVar99;
      fStack_298 = fVar18 * fVar102;
      fStack_294 = fVar23 * fVar105;
      fStack_290 = fVar28 * fVar108;
      fStack_28c = fVar33 * fVar111;
      fStack_288 = fVar38 * fVar113;
      auVar72._4_4_ = fVar140 * fVar99 * fVar127;
      auVar72._0_4_ = fVar202 * fVar86 * fVar245;
      auVar72._8_4_ = fVar18 * fVar102 * fVar142;
      auVar72._12_4_ = fVar23 * fVar105 * fVar139;
      auVar72._16_4_ = fVar28 * fVar108 * fVar145;
      auVar72._20_4_ = fVar33 * fVar111 * fVar16;
      auVar72._24_4_ = fVar38 * fVar113 * fVar17;
      auVar72._28_4_ = fStack_284;
      local_e0._0_8_ = auVar163._0_8_ ^ 0x8000000080000000;
      local_e0._8_4_ = -fVar19;
      local_e0._12_4_ = -fVar24;
      local_e0._16_4_ = -fVar29;
      local_e0._20_4_ = -fVar34;
      local_e0._24_4_ = -fVar39;
      local_e0._28_4_ = auVar163._28_4_ ^ 0x80000000;
      auVar205 = vblendvps_avx(auVar163,local_e0,auVar178);
      auVar246 = vsubps_avx(auVar151,auVar72);
      local_400 = vblendvps_avx(auVar205,auVar48,auVar152);
      local_100._0_8_ = local_520._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar18;
      local_100._12_4_ = -fVar23;
      local_100._16_4_ = -fVar28;
      local_100._20_4_ = -fVar33;
      local_100._24_4_ = -fVar38;
      local_100._28_4_ = -fVar126;
      auVar217._8_4_ = 0x7f800000;
      auVar217._0_8_ = 0x7f8000007f800000;
      auVar217._12_4_ = 0x7f800000;
      auVar217._16_4_ = 0x7f800000;
      auVar217._20_4_ = 0x7f800000;
      auVar217._24_4_ = 0x7f800000;
      auVar217._28_4_ = 0x7f800000;
      auVar218 = ZEXT3264(auVar217);
      auVar205 = vblendvps_avx(local_520,local_100,auVar178);
      local_3e0 = vblendvps_avx(auVar205,auVar246,auVar152);
      auVar199._8_4_ = 0x3f800000;
      auVar199._0_8_ = 0x3f8000003f800000;
      auVar199._12_4_ = 0x3f800000;
      auVar199._16_4_ = 0x3f800000;
      auVar199._20_4_ = 0x3f800000;
      auVar199._24_4_ = 0x3f800000;
      auVar199._28_4_ = 0x3f800000;
      local_a0 = vblendvps_avx(auVar199,ZEXT832(0) << 0x20,auVar178);
      auVar73._4_4_ = fVar127 * fStack_5bc;
      auVar73._0_4_ = fVar245 * local_5c0;
      auVar73._8_4_ = fVar142 * fStack_5b8;
      auVar73._12_4_ = fVar139 * fStack_5b4;
      auVar73._16_4_ = fVar145 * fStack_5b0;
      auVar73._20_4_ = fVar16 * fStack_5ac;
      auVar73._24_4_ = fVar17 * fStack_5a8;
      auVar73._28_4_ = auVar236._28_4_;
      local_480 = vblendvps_avx(local_a0,auVar73,auVar152);
      local_440._0_4_ = fVar88 + fVar116;
      local_440._4_4_ = fVar101 + fVar125;
      local_440._8_4_ = fVar104 + fStack_698;
      local_440._12_4_ = fVar107 + fStack_694;
      local_440._16_4_ = fVar110 + fStack_690;
      local_440._20_4_ = fVar172 + fStack_68c;
      local_440._24_4_ = fVar181 + fStack_688;
      local_440._28_4_ = auVar192._28_4_ + fStack_684;
      auVar170 = ZEXT3264(local_440);
      local_460 = ZEXT832(0) << 0x20;
      auVar152 = vblendvps_avx(auVar217,local_440,local_660);
      auVar178 = vshufps_avx(auVar152,auVar152,0xb1);
      auVar178 = vminps_avx(auVar152,auVar178);
      auVar192 = vshufpd_avx(auVar178,auVar178,5);
      auVar178 = vminps_avx(auVar178,auVar192);
      auVar192 = vperm2f128_avx(auVar178,auVar178,1);
      auVar178 = vminps_avx(auVar178,auVar192);
      auVar178 = vcmpps_avx(auVar152,auVar178,0);
      auVar192 = local_660 & auVar178;
      auVar180 = ZEXT3264(_local_6e0);
      auVar194 = ZEXT3264(_local_700);
      auVar200 = ZEXT3264(CONCAT428(local_500,
                                    CONCAT424(local_500,
                                              CONCAT420(local_500,
                                                        CONCAT416(local_500,
                                                                  CONCAT412(local_500,
                                                                            CONCAT48(local_500,
                                                                                     CONCAT44(
                                                  local_500,local_500))))))));
      auVar164 = ZEXT3264(auVar163);
      auVar206 = ZEXT3264(_local_600);
      auVar152 = local_660;
      if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar192 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar192 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar192 >> 0x7f,0) != '\0') ||
            (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar192 >> 0xbf,0) != '\0') ||
          (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar192[0x1f] < '\0') {
        auVar152 = vandps_avx(auVar178,local_660);
      }
      uVar81 = vmovmskps_avx(auVar152);
      uVar83 = 0;
      if (uVar81 != 0) {
        for (; (uVar81 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
        }
      }
      uVar81 = 1 << ((byte)k & 0x1f);
      local_6a0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar81 >> 4) * 0x10);
      auVar152 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar232 = ZEXT3264(auVar152);
      auVar153 = ZEXT3264(local_680);
      local_640 = local_660;
      local_5d0 = ray;
      local_5c8 = k;
      fStack_4fc = local_500;
      fStack_4f8 = local_500;
      fStack_4f4 = local_500;
      fStack_4f0 = local_500;
      fStack_4ec = local_500;
      fStack_4e8 = local_500;
      fStack_4e4 = local_500;
      while( true ) {
        auVar192 = auVar194._0_32_;
        auVar178 = auVar180._0_32_;
        auVar195 = auVar200._0_28_;
        auVar246 = auVar247._0_32_;
        auVar163 = auVar164._0_32_;
        auVar152 = auVar153._0_32_;
        auVar205 = auVar206._0_32_;
        auVar236 = auVar237._0_32_;
        uVar85 = (ulong)uVar83;
        uVar83 = *(uint *)(local_280 + uVar85 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar83].ptr;
        local_730.ray = (RTCRayN *)ray;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_640 + uVar85 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar2 = *(undefined4 *)(local_480 + uVar85 * 4);
            uVar3 = *(undefined4 *)(local_460 + uVar85 * 4);
            uVar80 = *(uint *)(local_440 + uVar85 * 4);
            *(uint *)(ray + k * 4 + 0x100) = uVar80;
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_420 + uVar85 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_400 + uVar85 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_3e0 + uVar85 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar2;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
            *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar85];
            *(uint *)(ray + k * 4 + 0x240) = uVar83;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            goto LAB_010f2763;
          }
          local_340 = auVar170._0_32_;
          local_1c0 = *(undefined4 *)(local_480 + uVar85 * 4);
          local_1a0 = *(undefined4 *)(local_460 + uVar85 * 4);
          local_180 = (line->primIDs).field_0.i[uVar85];
          local_220._4_4_ = *(undefined4 *)(local_420 + uVar85 * 4);
          local_200._4_4_ = *(undefined4 *)(local_400 + uVar85 * 4);
          auStack_150 = vpshufd_avx(ZEXT416(uVar83),0);
          local_1e0._4_4_ = *(undefined4 *)(local_3e0 + uVar85 * 4);
          local_220._0_4_ = local_220._4_4_;
          local_220._8_4_ = local_220._4_4_;
          local_220._12_4_ = local_220._4_4_;
          local_220._16_4_ = local_220._4_4_;
          local_220._20_4_ = local_220._4_4_;
          local_220._24_4_ = local_220._4_4_;
          local_220._28_4_ = local_220._4_4_;
          local_200._0_4_ = local_200._4_4_;
          local_200._8_4_ = local_200._4_4_;
          local_200._12_4_ = local_200._4_4_;
          local_200._16_4_ = local_200._4_4_;
          local_200._20_4_ = local_200._4_4_;
          local_200._24_4_ = local_200._4_4_;
          local_200._28_4_ = local_200._4_4_;
          local_1e0._0_4_ = local_1e0._4_4_;
          local_1e0._8_4_ = local_1e0._4_4_;
          local_1e0._12_4_ = local_1e0._4_4_;
          local_1e0._16_4_ = local_1e0._4_4_;
          local_1e0._20_4_ = local_1e0._4_4_;
          local_1e0._24_4_ = local_1e0._4_4_;
          local_1e0._28_4_ = local_1e0._4_4_;
          uStack_1bc = local_1c0;
          uStack_1b8 = local_1c0;
          uStack_1b4 = local_1c0;
          uStack_1b0 = local_1c0;
          uStack_1ac = local_1c0;
          uStack_1a8 = local_1c0;
          uStack_1a4 = local_1c0;
          uStack_19c = local_1a0;
          uStack_198 = local_1a0;
          uStack_194 = local_1a0;
          uStack_190 = local_1a0;
          uStack_18c = local_1a0;
          uStack_188 = local_1a0;
          uStack_184 = local_1a0;
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          local_160 = auStack_150;
          uStack_13c = context->user->instID[0];
          local_140 = uStack_13c;
          uStack_138 = uStack_13c;
          uStack_134 = uStack_13c;
          uStack_130 = uStack_13c;
          uStack_12c = uStack_13c;
          uStack_128 = uStack_13c;
          uStack_124 = uStack_13c;
          uStack_11c = context->user->instPrimID[0];
          local_120 = uStack_11c;
          uStack_118 = uStack_11c;
          uStack_114 = uStack_11c;
          uStack_110 = uStack_11c;
          uStack_10c = uStack_11c;
          uStack_108 = uStack_11c;
          uStack_104 = uStack_11c;
          local_250 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_440 + uVar85 * 4);
          local_6c0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar81 & 0xf) << 4));
          local_6b0 = *local_6a0;
          local_730.valid = (int *)local_6c0;
          local_730.geometryUserPtr = pGVar11->userPtr;
          local_730.context = context->user;
          local_730.hit = (RTCHitN *)local_220;
          local_730.N = 8;
          if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_660._0_8_ = line;
            local_380 = auVar232._0_32_;
            local_360 = auVar163;
            (*pGVar11->intersectionFilterN)(&local_730);
            auVar232 = ZEXT3264(local_380);
            auVar237 = ZEXT3264(local_540);
            auVar206 = ZEXT3264(_local_600);
            auVar247 = ZEXT3264(local_520);
            auVar164 = ZEXT3264(local_360);
            auVar200 = ZEXT3264(CONCAT428(fStack_4e4,
                                          CONCAT424(fStack_4e8,
                                                    CONCAT420(fStack_4ec,
                                                              CONCAT416(fStack_4f0,
                                                                        CONCAT412(fStack_4f4,
                                                                                  CONCAT48(
                                                  fStack_4f8,CONCAT44(fStack_4fc,local_500))))))));
            auVar194 = ZEXT3264(_local_700);
            auVar180 = ZEXT3264(_local_6e0);
            auVar218 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            line = (Primitive *)local_660._0_8_;
          }
          auVar128 = ZEXT816(0) << 0x40;
          auVar90 = vpcmpeqd_avx(auVar128,local_6c0);
          auVar43 = vpcmpeqd_avx(auVar128,local_6b0);
          auVar137._16_16_ = auVar43;
          auVar137._0_16_ = auVar90;
          auVar152 = auVar232._0_32_ & ~auVar137;
          if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar152 >> 0x7f,0) == '\0') &&
                (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar152 >> 0xbf,0) == '\0') &&
              (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar152[0x1f]) {
            auVar95._0_4_ = auVar232._0_4_ ^ auVar90._0_4_;
            auVar95._4_4_ = auVar232._4_4_ ^ auVar90._4_4_;
            auVar95._8_4_ = auVar232._8_4_ ^ auVar90._8_4_;
            auVar95._12_4_ = auVar232._12_4_ ^ auVar90._12_4_;
            auVar95._16_4_ = auVar232._16_4_ ^ auVar43._0_4_;
            auVar95._20_4_ = auVar232._20_4_ ^ auVar43._4_4_;
            auVar95._24_4_ = auVar232._24_4_ ^ auVar43._8_4_;
            auVar95._28_4_ = auVar232._28_4_ ^ auVar43._12_4_;
            auVar153 = ZEXT3264(local_680);
            auVar170 = ZEXT3264(local_340);
          }
          else {
            p_Var15 = context->args->filter;
            auVar153 = ZEXT3264(local_680);
            auVar170 = ZEXT3264(local_340);
            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              local_660._0_8_ = line;
              local_360 = auVar164._0_32_;
              local_380 = auVar232._0_32_;
              (*p_Var15)(&local_730);
              auVar128 = ZEXT816(0) << 0x40;
              auVar232 = ZEXT3264(local_380);
              auVar170 = ZEXT3264(local_340);
              auVar153 = ZEXT3264(local_680);
              auVar237 = ZEXT3264(local_540);
              auVar206 = ZEXT3264(_local_600);
              auVar247 = ZEXT3264(local_520);
              auVar164 = ZEXT3264(local_360);
              auVar200 = ZEXT3264(CONCAT428(fStack_4e4,
                                            CONCAT424(fStack_4e8,
                                                      CONCAT420(fStack_4ec,
                                                                CONCAT416(fStack_4f0,
                                                                          CONCAT412(fStack_4f4,
                                                                                    CONCAT48(
                                                  fStack_4f8,CONCAT44(fStack_4fc,local_500))))))));
              auVar194 = ZEXT3264(_local_700);
              auVar180 = ZEXT3264(_local_6e0);
              auVar218 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              line = (Primitive *)local_660._0_8_;
            }
            auVar90 = vpcmpeqd_avx(auVar128,local_6c0);
            auVar43 = vpcmpeqd_avx(auVar128,local_6b0);
            auVar122._16_16_ = auVar43;
            auVar122._0_16_ = auVar90;
            auVar95._0_4_ = auVar232._0_4_ ^ auVar90._0_4_;
            auVar95._4_4_ = auVar232._4_4_ ^ auVar90._4_4_;
            auVar95._8_4_ = auVar232._8_4_ ^ auVar90._8_4_;
            auVar95._12_4_ = auVar232._12_4_ ^ auVar90._12_4_;
            auVar95._16_4_ = auVar232._16_4_ ^ auVar43._0_4_;
            auVar95._20_4_ = auVar232._20_4_ ^ auVar43._4_4_;
            auVar95._24_4_ = auVar232._24_4_ ^ auVar43._8_4_;
            auVar95._28_4_ = auVar232._28_4_ ^ auVar43._12_4_;
            auVar152 = auVar232._0_32_ & ~auVar122;
            if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar152 >> 0x7f,0) != '\0') ||
                  (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar152 >> 0xbf,0) != '\0') ||
                (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar152[0x1f] < '\0') {
              auVar152 = vmaskmovps_avx(auVar95,*(undefined1 (*) [32])local_730.hit);
              *(undefined1 (*) [32])(local_730.ray + 0x180) = auVar152;
              auVar152 = vmaskmovps_avx(auVar95,*(undefined1 (*) [32])(local_730.hit + 0x20));
              *(undefined1 (*) [32])(local_730.ray + 0x1a0) = auVar152;
              auVar152 = vmaskmovps_avx(auVar95,*(undefined1 (*) [32])(local_730.hit + 0x40));
              *(undefined1 (*) [32])(local_730.ray + 0x1c0) = auVar152;
              auVar152 = vmaskmovps_avx(auVar95,*(undefined1 (*) [32])(local_730.hit + 0x60));
              *(undefined1 (*) [32])(local_730.ray + 0x1e0) = auVar152;
              auVar152 = vmaskmovps_avx(auVar95,*(undefined1 (*) [32])(local_730.hit + 0x80));
              *(undefined1 (*) [32])(local_730.ray + 0x200) = auVar152;
              auVar152 = vmaskmovps_avx(auVar95,*(undefined1 (*) [32])(local_730.hit + 0xa0));
              *(undefined1 (*) [32])(local_730.ray + 0x220) = auVar152;
              auVar152 = vmaskmovps_avx(auVar95,*(undefined1 (*) [32])(local_730.hit + 0xc0));
              *(undefined1 (*) [32])(local_730.ray + 0x240) = auVar152;
              auVar152 = vmaskmovps_avx(auVar95,*(undefined1 (*) [32])(local_730.hit + 0xe0));
              *(undefined1 (*) [32])(local_730.ray + 0x260) = auVar152;
              auVar152 = vmaskmovps_avx(auVar95,*(undefined1 (*) [32])(local_730.hit + 0x100));
              *(undefined1 (*) [32])(local_730.ray + 0x280) = auVar152;
            }
          }
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar95 >> 0x7f,0) == '\0') &&
                (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0xbf,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar95[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = local_250._0_4_;
            auVar90 = local_250;
          }
          else {
            auVar90 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_640 + uVar85 * 4) = 0;
          auVar90 = vshufps_avx(auVar90,auVar90,0);
          auVar96._16_16_ = auVar90;
          auVar96._0_16_ = auVar90;
          auVar152 = vcmpps_avx(auVar170._0_32_,auVar96,2);
          local_640 = vandps_avx(auVar152,local_640);
        }
        auVar192 = auVar194._0_32_;
        auVar178 = auVar180._0_32_;
        auVar195 = auVar200._0_28_;
        auVar246 = auVar247._0_32_;
        auVar163 = auVar164._0_32_;
        auVar152 = auVar153._0_32_;
        auVar205 = auVar206._0_32_;
        auVar236 = auVar237._0_32_;
        if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_640 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_640 >> 0x7f,0) == '\0') &&
              (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_640 >> 0xbf,0) == '\0') &&
            (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_640[0x1f]) break;
        auVar152 = vblendvps_avx(auVar218._0_32_,auVar170._0_32_,local_640);
        auVar163 = vshufps_avx(auVar152,auVar152,0xb1);
        auVar163 = vminps_avx(auVar152,auVar163);
        auVar178 = vshufpd_avx(auVar163,auVar163,5);
        auVar163 = vminps_avx(auVar163,auVar178);
        auVar178 = vperm2f128_avx(auVar163,auVar163,1);
        auVar163 = vminps_avx(auVar163,auVar178);
        auVar163 = vcmpps_avx(auVar152,auVar163,0);
        auVar178 = local_640 & auVar163;
        auVar152 = local_640;
        if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar178 >> 0x7f,0) != '\0') ||
              (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar178 >> 0xbf,0) != '\0') ||
            (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar178[0x1f] < '\0') {
          auVar152 = vandps_avx(auVar163,local_640);
        }
        uVar80 = vmovmskps_avx(auVar152);
        uVar83 = 0;
        if (uVar80 != 0) {
          for (; (uVar80 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
          }
        }
      }
      uVar80 = *(uint *)(ray + k * 4 + 0x100);
LAB_010f2763:
      auVar164 = ZEXT464(uVar80);
      auVar48 = vandps_avx(local_4e0,local_4c0);
      auVar90 = vshufps_avx(ZEXT416(uVar80),ZEXT416(uVar80),0);
      auVar123._16_16_ = auVar90;
      auVar123._0_16_ = auVar90;
      auVar49 = vcmpps_avx(local_620,auVar123,2);
      auVar44 = auVar48 & auVar49;
      if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar44 >> 0x7f,0) != '\0') ||
            (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar44 >> 0xbf,0) != '\0') ||
          (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar44[0x1f] < '\0') {
        auVar44 = vcmpps_avx(local_2e0,local_560,0);
        auVar152 = vblendvps_avx(auVar152,local_c0,auVar44);
        auVar163 = vblendvps_avx(auVar163,local_e0,auVar44);
        auVar246 = vblendvps_avx(auVar246,local_100,auVar44);
        auVar44 = vcmpps_avx(local_2e0,local_3a0,0);
        auVar45 = vcmpps_avx(local_2e0,local_5a0,0);
        auVar44 = vorps_avx(auVar44,auVar45);
        fVar202 = local_2e0._0_4_;
        fVar208 = local_2e0._4_4_;
        fVar245 = local_2e0._8_4_;
        fVar142 = local_2e0._12_4_;
        fVar115 = local_2e0._16_4_;
        fVar127 = local_2e0._20_4_;
        fVar139 = local_2e0._24_4_;
        auVar169._0_4_ =
             (float)local_240._0_4_ * (fVar202 * auVar178._0_4_ + (float)local_4a0._0_4_) +
             local_2c0;
        auVar169._4_4_ =
             (float)local_240._4_4_ * (fVar208 * auVar178._4_4_ + (float)local_4a0._4_4_) +
             fStack_2bc;
        auVar169._8_4_ = fStack_238 * (fVar245 * auVar178._8_4_ + fStack_498) + fStack_2b8;
        auVar169._12_4_ = fStack_234 * (fVar142 * auVar178._12_4_ + fStack_494) + fStack_2b4;
        auVar169._16_4_ = fStack_230 * (fVar115 * auVar178._16_4_ + fStack_490) + fStack_2b0;
        auVar169._20_4_ = fStack_22c * (fVar127 * auVar178._20_4_ + fStack_48c) + fStack_2ac;
        auVar169._24_4_ = fStack_228 * (fVar139 * auVar178._24_4_ + fStack_488) + fStack_2a8;
        auVar169._28_4_ = auVar45._28_4_ + fStack_484 + fStack_2a4;
        auVar179._0_4_ =
             (float)local_240._0_4_ * (auVar205._0_4_ + auVar192._0_4_ * fVar202) + local_300;
        auVar179._4_4_ =
             (float)local_240._4_4_ * (auVar205._4_4_ + auVar192._4_4_ * fVar208) + fStack_2fc;
        auVar179._8_4_ = fStack_238 * (auVar205._8_4_ + auVar192._8_4_ * fVar245) + fStack_2f8;
        auVar179._12_4_ = fStack_234 * (auVar205._12_4_ + auVar192._12_4_ * fVar142) + fStack_2f4;
        auVar179._16_4_ = fStack_230 * (auVar205._16_4_ + auVar192._16_4_ * fVar115) + fStack_2f0;
        auVar179._20_4_ = fStack_22c * (auVar205._20_4_ + auVar192._20_4_ * fVar127) + fStack_2ec;
        auVar179._24_4_ = fStack_228 * (auVar205._24_4_ + auVar192._24_4_ * fVar139) + fStack_2e8;
        auVar179._28_4_ = auVar205._28_4_ + auVar178._28_4_ + fStack_2e4;
        auVar193._0_4_ =
             (float)local_240._0_4_ * (auVar236._0_4_ + auVar195._0_4_ * fVar202) + local_80;
        auVar193._4_4_ =
             (float)local_240._4_4_ * (auVar236._4_4_ + auVar195._4_4_ * fVar208) + fStack_7c;
        auVar193._8_4_ = fStack_238 * (auVar236._8_4_ + auVar195._8_4_ * fVar245) + fStack_78;
        auVar193._12_4_ = fStack_234 * (auVar236._12_4_ + auVar195._12_4_ * fVar142) + fStack_74;
        auVar193._16_4_ = fStack_230 * (auVar236._16_4_ + auVar195._16_4_ * fVar115) + fStack_70;
        auVar193._20_4_ = fStack_22c * (auVar236._20_4_ + auVar195._20_4_ * fVar127) + fStack_6c;
        auVar193._24_4_ = fStack_228 * (auVar236._24_4_ + auVar195._24_4_ * fVar139) + fStack_68;
        auVar193._28_4_ = auVar236._28_4_ + auVar192._28_4_ + fStack_64;
        auVar74._4_4_ = (float)local_3c0._4_4_ * fStack_31c;
        auVar74._0_4_ = (float)local_3c0._0_4_ * local_320;
        auVar74._8_4_ = fStack_3b8 * fStack_318;
        auVar74._12_4_ = fStack_3b4 * fStack_314;
        auVar74._16_4_ = fStack_3b0 * fStack_310;
        auVar74._20_4_ = fStack_3ac * fStack_30c;
        auVar74._24_4_ = fStack_3a8 * fStack_308;
        auVar74._28_4_ = uStack_224;
        auVar178 = vsubps_avx(auVar169,auVar74);
        auVar75._4_4_ = (float)local_3c0._4_4_ * fStack_57c;
        auVar75._0_4_ = (float)local_3c0._0_4_ * local_580;
        auVar75._8_4_ = fStack_3b8 * fStack_578;
        auVar75._12_4_ = fStack_3b4 * fStack_574;
        auVar75._16_4_ = fStack_3b0 * fStack_570;
        auVar75._20_4_ = fStack_3ac * fStack_56c;
        auVar75._24_4_ = fStack_3a8 * fStack_568;
        auVar75._28_4_ = uStack_224;
        auVar192 = vsubps_avx(auVar179,auVar75);
        auVar76._4_4_ = (float)local_3c0._4_4_ * fStack_29c;
        auVar76._0_4_ = (float)local_3c0._0_4_ * local_2a0;
        auVar76._8_4_ = fStack_3b8 * fStack_298;
        auVar76._12_4_ = fStack_3b4 * fStack_294;
        auVar76._16_4_ = fStack_3b0 * fStack_290;
        auVar76._20_4_ = fStack_3ac * fStack_28c;
        auVar76._24_4_ = fStack_3a8 * fStack_288;
        auVar76._28_4_ = uStack_224;
        auVar205 = vsubps_avx(auVar193,auVar76);
        local_420 = vblendvps_avx(auVar152,auVar178,auVar44);
        local_400 = vblendvps_avx(auVar163,auVar192,auVar44);
        local_3e0 = vblendvps_avx(auVar246,auVar205,auVar44);
        auVar77._4_4_ = (float)local_3c0._4_4_ * fStack_5bc;
        auVar77._0_4_ = (float)local_3c0._0_4_ * local_5c0;
        auVar77._8_4_ = fStack_3b8 * fStack_5b8;
        auVar77._12_4_ = fStack_3b4 * fStack_5b4;
        auVar77._16_4_ = fStack_3b0 * fStack_5b0;
        auVar77._20_4_ = fStack_3ac * fStack_5ac;
        auVar77._24_4_ = fStack_3a8 * fStack_5a8;
        auVar77._28_4_ = auVar178._28_4_;
        local_480 = vblendvps_avx(local_a0,auVar77,auVar44);
        local_640 = vandps_avx(auVar49,auVar48);
        local_460 = ZEXT832(0) << 0x20;
        local_440 = local_620;
        auVar152 = vblendvps_avx(auVar218._0_32_,local_620,local_640);
        auVar163 = vshufps_avx(auVar152,auVar152,0xb1);
        auVar163 = vminps_avx(auVar152,auVar163);
        auVar178 = vshufpd_avx(auVar163,auVar163,5);
        auVar163 = vminps_avx(auVar163,auVar178);
        auVar178 = vperm2f128_avx(auVar163,auVar163,1);
        auVar163 = vminps_avx(auVar163,auVar178);
        auVar163 = vcmpps_avx(auVar152,auVar163,0);
        auVar84 = (undefined1  [8])context->scene;
        auVar178 = local_640 & auVar163;
        auVar152 = local_640;
        if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar178 >> 0x7f,0) != '\0') ||
              (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar178 >> 0xbf,0) != '\0') ||
            (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar178[0x1f] < '\0') {
          auVar152 = vandps_avx(auVar163,local_640);
        }
        uVar80 = vmovmskps_avx(auVar152);
        uVar83 = 0;
        if (uVar80 != 0) {
          for (; (uVar80 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
          }
        }
        auVar152 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar170 = ZEXT3264(auVar152);
        auVar180 = ZEXT864(0) << 0x20;
        do {
          uVar85 = (ulong)uVar83;
          uVar83 = *(uint *)(local_280 + uVar85 * 4);
          pGVar11 = (((Scene *)auVar84)->geometries).items[uVar83].ptr;
          if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_640 + uVar85 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar2 = *(undefined4 *)(local_480 + uVar85 * 4);
              uVar3 = *(undefined4 *)(local_460 + uVar85 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_440 + uVar85 * 4);
              *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_420 + uVar85 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_400 + uVar85 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_3e0 + uVar85 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar2;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
              *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar85];
              *(uint *)(ray + k * 4 + 0x240) = uVar83;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              return;
            }
            local_1c0 = *(undefined4 *)(local_480 + uVar85 * 4);
            local_1a0 = *(undefined4 *)(local_460 + uVar85 * 4);
            auStack_150 = vpshufd_avx(ZEXT416(uVar83),0);
            local_180 = (line->primIDs).field_0.i[uVar85];
            uVar2 = *(undefined4 *)(local_420 + uVar85 * 4);
            local_220._4_4_ = uVar2;
            local_220._0_4_ = uVar2;
            local_220._8_4_ = uVar2;
            local_220._12_4_ = uVar2;
            local_220._16_4_ = uVar2;
            local_220._20_4_ = uVar2;
            local_220._24_4_ = uVar2;
            local_220._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(local_400 + uVar85 * 4);
            local_200._4_4_ = uVar2;
            local_200._0_4_ = uVar2;
            local_200._8_4_ = uVar2;
            local_200._12_4_ = uVar2;
            local_200._16_4_ = uVar2;
            local_200._20_4_ = uVar2;
            local_200._24_4_ = uVar2;
            local_200._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(local_3e0 + uVar85 * 4);
            local_1e0._4_4_ = uVar2;
            local_1e0._0_4_ = uVar2;
            local_1e0._8_4_ = uVar2;
            local_1e0._12_4_ = uVar2;
            local_1e0._16_4_ = uVar2;
            local_1e0._20_4_ = uVar2;
            local_1e0._24_4_ = uVar2;
            local_1e0._28_4_ = uVar2;
            uStack_1bc = local_1c0;
            uStack_1b8 = local_1c0;
            uStack_1b4 = local_1c0;
            uStack_1b0 = local_1c0;
            uStack_1ac = local_1c0;
            uStack_1a8 = local_1c0;
            uStack_1a4 = local_1c0;
            uStack_19c = local_1a0;
            uStack_198 = local_1a0;
            uStack_194 = local_1a0;
            uStack_190 = local_1a0;
            uStack_18c = local_1a0;
            uStack_188 = local_1a0;
            uStack_184 = local_1a0;
            uStack_17c = local_180;
            uStack_178 = local_180;
            uStack_174 = local_180;
            uStack_170 = local_180;
            uStack_16c = local_180;
            uStack_168 = local_180;
            uStack_164 = local_180;
            local_160 = auStack_150;
            _local_700 = auVar170._0_32_;
            uStack_13c = context->user->instID[0];
            local_140 = uStack_13c;
            uStack_138 = uStack_13c;
            uStack_134 = uStack_13c;
            uStack_130 = uStack_13c;
            uStack_12c = uStack_13c;
            uStack_128 = uStack_13c;
            uStack_124 = uStack_13c;
            uStack_11c = context->user->instPrimID[0];
            local_120 = uStack_11c;
            uStack_118 = uStack_11c;
            uStack_114 = uStack_11c;
            uStack_110 = uStack_11c;
            uStack_10c = uStack_11c;
            uStack_108 = uStack_11c;
            uStack_104 = uStack_11c;
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_440 + uVar85 * 4);
            local_6c0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar81 & 0xf) << 4));
            local_6b0 = *local_6a0;
            local_730.valid = (int *)local_6c0;
            local_730.geometryUserPtr = pGVar11->userPtr;
            local_730.context = context->user;
            local_730.hit = (RTCHitN *)local_220;
            local_730.N = 8;
            local_730.ray = (RTCRayN *)ray;
            if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              local_660._0_8_ = line;
              local_680._0_16_ = auVar164._0_16_;
              local_6e0 = auVar84;
              (*pGVar11->intersectionFilterN)(&local_730);
              auVar180 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar170 = ZEXT3264(_local_700);
              auVar164 = ZEXT1664(local_680._0_16_);
              auVar84 = local_6e0;
              line = (Primitive *)local_660._0_8_;
            }
            auVar90 = vpcmpeqd_avx(auVar180._0_16_,local_6c0);
            auVar43 = vpcmpeqd_avx(auVar180._0_16_,local_6b0);
            auVar138._16_16_ = auVar43;
            auVar138._0_16_ = auVar90;
            _local_700 = auVar170._0_32_;
            auVar152 = _local_700 & ~auVar138;
            if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar152 >> 0x7f,0) == '\0') &&
                  (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar152 >> 0xbf,0) == '\0') &&
                (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar152[0x1f]) {
              auVar97._0_4_ = auVar90._0_4_ ^ auVar170._0_4_;
              auVar97._4_4_ = auVar90._4_4_ ^ auVar170._4_4_;
              auVar97._8_4_ = auVar90._8_4_ ^ auVar170._8_4_;
              auVar97._12_4_ = auVar90._12_4_ ^ auVar170._12_4_;
              auVar97._16_4_ = auVar43._0_4_ ^ auVar170._16_4_;
              auVar97._20_4_ = auVar43._4_4_ ^ auVar170._20_4_;
              auVar97._24_4_ = auVar43._8_4_ ^ auVar170._24_4_;
              auVar97._28_4_ = auVar43._12_4_ ^ auVar170._28_4_;
              auVar218 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            }
            else {
              p_Var15 = context->args->filter;
              if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0))))
              {
                local_680._0_16_ = auVar164._0_16_;
                local_6e0 = auVar84;
                (*p_Var15)(&local_730);
                auVar180 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar170 = ZEXT3264(_local_700);
                auVar164 = ZEXT1664(local_680._0_16_);
                auVar84 = local_6e0;
              }
              auVar90 = vpcmpeqd_avx(auVar180._0_16_,local_6c0);
              auVar43 = vpcmpeqd_avx(auVar180._0_16_,local_6b0);
              auVar124._16_16_ = auVar43;
              auVar124._0_16_ = auVar90;
              auVar97._0_4_ = auVar90._0_4_ ^ auVar170._0_4_;
              auVar97._4_4_ = auVar90._4_4_ ^ auVar170._4_4_;
              auVar97._8_4_ = auVar90._8_4_ ^ auVar170._8_4_;
              auVar97._12_4_ = auVar90._12_4_ ^ auVar170._12_4_;
              auVar97._16_4_ = auVar43._0_4_ ^ auVar170._16_4_;
              auVar97._20_4_ = auVar43._4_4_ ^ auVar170._20_4_;
              auVar97._24_4_ = auVar43._8_4_ ^ auVar170._24_4_;
              auVar97._28_4_ = auVar43._12_4_ ^ auVar170._28_4_;
              auVar152 = auVar170._0_32_ & ~auVar124;
              auVar218 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar152 >> 0x7f,0) != '\0') ||
                    (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar152 >> 0xbf,0) != '\0') ||
                  (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar152[0x1f] < '\0') {
                auVar152 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])local_730.hit);
                *(undefined1 (*) [32])(local_730.ray + 0x180) = auVar152;
                auVar152 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_730.hit + 0x20));
                *(undefined1 (*) [32])(local_730.ray + 0x1a0) = auVar152;
                auVar152 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_730.hit + 0x40));
                *(undefined1 (*) [32])(local_730.ray + 0x1c0) = auVar152;
                auVar152 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_730.hit + 0x60));
                *(undefined1 (*) [32])(local_730.ray + 0x1e0) = auVar152;
                auVar152 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_730.hit + 0x80));
                *(undefined1 (*) [32])(local_730.ray + 0x200) = auVar152;
                auVar152 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_730.hit + 0xa0));
                *(undefined1 (*) [32])(local_730.ray + 0x220) = auVar152;
                auVar152 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_730.hit + 0xc0));
                *(undefined1 (*) [32])(local_730.ray + 0x240) = auVar152;
                auVar152 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_730.hit + 0xe0));
                *(undefined1 (*) [32])(local_730.ray + 0x260) = auVar152;
                auVar152 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])(local_730.hit + 0x100));
                *(undefined1 (*) [32])(local_730.ray + 0x280) = auVar152;
              }
            }
            if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar97 >> 0x7f,0) == '\0') &&
                  (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar97 >> 0xbf,0) == '\0') &&
                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar97[0x1f]) {
              *(int *)(ray + k * 4 + 0x100) = auVar164._0_4_;
            }
            else {
              auVar164 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
            }
            *(undefined4 *)(local_640 + uVar85 * 4) = 0;
            auVar90 = vshufps_avx(auVar164._0_16_,auVar164._0_16_,0);
            auVar98._16_16_ = auVar90;
            auVar98._0_16_ = auVar90;
            auVar152 = vcmpps_avx(local_620,auVar98,2);
            local_640 = vandps_avx(auVar152,local_640);
          }
          if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_640 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_640 >> 0x7f,0) == '\0') &&
                (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_640 >> 0xbf,0) == '\0') &&
              (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_640[0x1f]) {
            return;
          }
          auVar152 = vblendvps_avx(auVar218._0_32_,local_620,local_640);
          auVar163 = vshufps_avx(auVar152,auVar152,0xb1);
          auVar163 = vminps_avx(auVar152,auVar163);
          auVar178 = vshufpd_avx(auVar163,auVar163,5);
          auVar163 = vminps_avx(auVar163,auVar178);
          auVar178 = vperm2f128_avx(auVar163,auVar163,1);
          auVar163 = vminps_avx(auVar163,auVar178);
          auVar163 = vcmpps_avx(auVar152,auVar163,0);
          auVar178 = local_640 & auVar163;
          auVar152 = local_640;
          if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar178 >> 0x7f,0) != '\0') ||
                (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar178 >> 0xbf,0) != '\0') ||
              (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar178[0x1f] < '\0') {
            auVar152 = vandps_avx(auVar163,local_640);
          }
          uVar80 = vmovmskps_avx(auVar152);
          uVar83 = 0;
          if (uVar80 != 0) {
            for (; (uVar80 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context,  const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }